

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution1D_x86_fma::forward
          (Convolution1D_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  _func_int *p_Var7;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  float *pfVar12;
  size_t sVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int *piVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  undefined4 *puVar28;
  long lVar29;
  ulong uVar30;
  undefined1 (*pauVar31) [32];
  undefined4 *puVar32;
  uint *puVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  undefined1 (*pauVar41) [16];
  uint uVar42;
  uint uVar43;
  long lVar44;
  ulong uVar45;
  undefined1 (*pauVar46) [32];
  long lVar47;
  long lVar48;
  long lVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  undefined1 (*pauVar53) [32];
  undefined1 (*pauVar54) [16];
  undefined4 *puVar55;
  uint *puVar56;
  long lVar57;
  ulong uVar58;
  long lVar59;
  ulong uVar60;
  long lVar61;
  ulong uVar62;
  long lVar63;
  ulong uVar64;
  float *pfVar65;
  long lVar66;
  long lVar67;
  undefined1 (*pauVar68) [32];
  undefined4 *puVar69;
  ulong uVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  int iVar74;
  ulong uVar75;
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar82 [64];
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 extraout_var_00 [60];
  float fVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  undefined1 auVar109 [32];
  float fVar111;
  undefined1 auVar110 [64];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar112;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  undefined1 auVar139 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar138;
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar140 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar247 [64];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  __m128 pos;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [32];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [32];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [64];
  int local_220;
  long local_1f8;
  undefined1 (*local_1f0) [32];
  undefined1 local_1d8 [16];
  long local_1c8;
  undefined1 (*local_1c0) [16];
  undefined1 local_1b8 [16];
  int local_198;
  int local_138;
  Mat local_88;
  ulong local_38;
  undefined1 auVar106 [32];
  undefined1 auVar108 [32];
  
  uVar26 = bottom_blob->elemsize;
  iVar4 = bottom_blob->elempack;
  p_Var7 = this->_vptr_Convolution1D_x86_fma[-3];
  iVar36 = *(int *)(&this->field_0xd4 + (long)p_Var7);
  iVar5 = *(int *)(&this->field_0xd8 + (long)p_Var7);
  local_88.cstep = 0;
  local_88.data = (void *)0x0;
  local_88.refcount._0_4_ = 0;
  local_88.refcount._4_4_ = 0;
  local_88.elemsize._0_4_ = 0;
  local_88.elemsize._4_4_ = 0;
  local_88.elempack = 0;
  local_88.allocator = (Allocator *)0x0;
  local_88.dims = 0;
  local_88.w = 0;
  local_88.h = 0;
  local_88.d = 0;
  local_88.c = 0;
  Convolution1D::make_padding
            ((Convolution1D *)((long)&this->_vptr_Convolution1D_x86_fma + (long)p_Var7),bottom_blob,
             &local_88,opt);
  local_198 = -100;
  if ((local_88.data != (void *)0x0) && ((long)local_88.c * local_88.cstep != 0)) {
    uVar43 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_fma[-3]);
    if (opt->use_packing_layout == true) {
      lVar61 = (ulong)((uVar43 & 3) == 0) * 3 + 1;
      if ((uVar43 & 7) == 0) {
        lVar61 = 8;
      }
    }
    else {
      lVar61 = 1;
    }
    Mat::create(top_blob,(local_88.w + ~((iVar36 + -1) * iVar5)) /
                         *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_fma[-3]) +
                         1,(int)uVar43 / (int)lVar61,lVar61 * (uVar26 / (ulong)(long)iVar4),
                (int)lVar61,opt->blob_allocator);
    iVar4 = local_88.elempack;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      p_Var7 = this->_vptr_Convolution1D_x86_fma[-3];
      iVar36 = *(int *)(&this->field_0xd8 + (long)p_Var7);
      lVar48 = (long)iVar36;
      iVar5 = *(int *)(&this->field_0xdc + (long)p_Var7);
      iVar6 = *(int *)(&this->field_0xf4 + (long)p_Var7);
      lVar57 = (long)local_88.elempack;
      lVar37 = (long)local_88.h;
      iVar34 = local_88.w * local_88.elempack;
      local_38 = (ulong)top_blob->w;
      uVar21 = (long)top_blob->h * (long)top_blob->elempack;
      lVar63 = (long)top_blob->elempack * local_38;
      lVar61 = *(long *)(&this->field_0x190 + (long)p_Var7);
      iVar52 = (int)uVar21;
      uVar26 = (long)((ulong)(uint)(iVar52 >> 0x1f) << 0x20 | uVar21 & 0xffffffff) / 8;
      lVar44 = (long)(iVar36 * 8);
      lVar47 = (long)iVar34;
      lVar38 = (long)(iVar36 * 4);
      lVar72 = (long)(iVar34 * 2);
      lVar73 = (long)(iVar34 * 3);
      lVar22 = (long)(iVar34 * 4);
      lVar23 = (long)(iVar34 * 5);
      lVar24 = (long)(iVar34 * 6);
      lVar25 = (long)(iVar34 * 7);
      iVar36 = (int)lVar63;
      uVar64 = 0;
      uVar75 = (ulong)*(uint *)(&this->field_0xd4 + (long)p_Var7);
      if ((int)*(uint *)(&this->field_0xd4 + (long)p_Var7) < 1) {
        uVar75 = uVar64;
      }
      iVar34 = (int)uVar26;
      uVar58 = 0;
      if (0 < iVar34) {
        uVar58 = uVar26 & 0xffffffff;
      }
      lVar49 = lVar48 * 4;
      auVar82 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar177 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar214._8_4_ = 0x3f800000;
      auVar214._0_8_ = 0x3f8000003f800000;
      auVar214._12_4_ = 0x3f800000;
      auVar214._16_4_ = 0x3f800000;
      auVar214._20_4_ = 0x3f800000;
      auVar214._24_4_ = 0x3f800000;
      auVar214._28_4_ = 0x3f800000;
      lVar1 = lVar38 * 4;
      lVar2 = (long)iVar5 * 4;
      auVar299._8_4_ = 0x42b0c0a5;
      auVar299._0_8_ = 0x42b0c0a542b0c0a5;
      auVar299._12_4_ = 0x42b0c0a5;
      auVar299._16_4_ = 0x42b0c0a5;
      auVar299._20_4_ = 0x42b0c0a5;
      auVar299._24_4_ = 0x42b0c0a5;
      auVar299._28_4_ = 0x42b0c0a5;
      auVar311._8_4_ = 0xc2b0c0a5;
      auVar311._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar311._12_4_ = 0xc2b0c0a5;
      auVar311._16_4_ = 0xc2b0c0a5;
      auVar311._20_4_ = 0xc2b0c0a5;
      auVar311._24_4_ = 0xc2b0c0a5;
      auVar311._28_4_ = 0xc2b0c0a5;
      auVar254._8_4_ = 0xb95e8083;
      auVar254._0_8_ = 0xb95e8083b95e8083;
      auVar254._12_4_ = 0xb95e8083;
      auVar254._16_4_ = 0xb95e8083;
      auVar254._20_4_ = 0xb95e8083;
      auVar254._24_4_ = 0xb95e8083;
      auVar254._28_4_ = 0xb95e8083;
      for (; iVar74 = (int)uVar75, uVar64 != uVar58; uVar64 = uVar64 + 1) {
        uVar43 = top_blob->w;
        iVar74 = top_blob->elempack;
        local_1f0 = (undefined1 (*) [32])
                    ((long)(int)((long)((ulong)(uint)((int)(uVar64 * 8) >> 0x1f) << 0x20 |
                                       uVar64 * 8 & 0xffffffff) / (long)iVar74) * (long)(int)uVar43
                     * top_blob->elemsize + (long)top_blob->data);
        lVar59 = (long)local_88.h * (long)local_88.elempack;
        local_1c8 = 0;
        uVar26 = 0;
        if (0 < (int)uVar43) {
          uVar26 = (ulong)uVar43;
        }
        iVar50 = 0;
        local_1f8 = lVar47 * 4;
        for (uVar70 = 0; uVar70 != uVar26; uVar70 = uVar70 + 1) {
          auVar247 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar110 = ZEXT1664(ZEXT816(0) << 0x40);
          if (lVar61 != 0) {
            auVar110 = ZEXT3264(*(undefined1 (*) [32])(lVar61 + uVar64 * 0x20));
          }
          pauVar53 = (undefined1 (*) [32])
                     ((this->weight_data_tm).cstep * uVar64 * (this->weight_data_tm).elemsize +
                     (long)(this->weight_data_tm).data);
          iVar19 = local_88.elempack * iVar5 * (int)uVar70;
          lVar39 = (long)local_88.w *
                   CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
          lVar66 = (long)local_88.data + local_1f8;
          puVar69 = (undefined4 *)((long)local_88.data + local_1c8);
          uVar60 = 0;
          auVar320 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar137 = ZEXT1664(ZEXT816(0) << 0x40);
          while( true ) {
            local_220 = (int)lVar59;
            if (local_220 <= (int)((uint)uVar60 | 7)) break;
            lVar27 = (int)((long)((ulong)(uint)((int)(uint)uVar60 >> 0x1f) << 0x20 |
                                 uVar60 & 0xffffffff) / (long)local_88.elempack) * lVar39;
            if (local_88.elempack == 8) {
              puVar28 = (undefined4 *)((long)local_88.data + lVar27 + (long)iVar50 * 4);
              pauVar31 = pauVar53;
              uVar45 = uVar75;
              while (iVar51 = (int)uVar45, uVar45 = (ulong)(iVar51 - 1), iVar51 != 0) {
                uVar3 = *puVar28;
                auVar144._4_4_ = uVar3;
                auVar144._0_4_ = uVar3;
                auVar144._8_4_ = uVar3;
                auVar144._12_4_ = uVar3;
                auVar144._16_4_ = uVar3;
                auVar144._20_4_ = uVar3;
                auVar144._24_4_ = uVar3;
                auVar144._28_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar144,auVar110._0_32_,*pauVar31);
                uVar3 = puVar28[1];
                auVar249._4_4_ = uVar3;
                auVar249._0_4_ = uVar3;
                auVar249._8_4_ = uVar3;
                auVar249._12_4_ = uVar3;
                auVar249._16_4_ = uVar3;
                auVar249._20_4_ = uVar3;
                auVar249._24_4_ = uVar3;
                auVar249._28_4_ = uVar3;
                auVar139 = vfmadd132ps_fma(auVar249,auVar137._0_32_,pauVar31[1]);
                uVar3 = puVar28[2];
                auVar267._4_4_ = uVar3;
                auVar267._0_4_ = uVar3;
                auVar267._8_4_ = uVar3;
                auVar267._12_4_ = uVar3;
                auVar267._16_4_ = uVar3;
                auVar267._20_4_ = uVar3;
                auVar267._24_4_ = uVar3;
                auVar267._28_4_ = uVar3;
                auVar213 = vfmadd132ps_fma(auVar267,auVar320._0_32_,pauVar31[2]);
                uVar3 = puVar28[3];
                auVar280._4_4_ = uVar3;
                auVar280._0_4_ = uVar3;
                auVar280._8_4_ = uVar3;
                auVar280._12_4_ = uVar3;
                auVar280._16_4_ = uVar3;
                auVar280._20_4_ = uVar3;
                auVar280._24_4_ = uVar3;
                auVar280._28_4_ = uVar3;
                auVar220 = vfmadd132ps_fma(auVar280,auVar247._0_32_,pauVar31[3]);
                uVar3 = puVar28[4];
                auVar103._4_4_ = uVar3;
                auVar103._0_4_ = uVar3;
                auVar103._8_4_ = uVar3;
                auVar103._12_4_ = uVar3;
                auVar103._16_4_ = uVar3;
                auVar103._20_4_ = uVar3;
                auVar103._24_4_ = uVar3;
                auVar103._28_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar103,ZEXT1632(auVar113),pauVar31[4]);
                auVar110 = ZEXT1664(auVar113);
                uVar3 = puVar28[5];
                auVar122._4_4_ = uVar3;
                auVar122._0_4_ = uVar3;
                auVar122._8_4_ = uVar3;
                auVar122._12_4_ = uVar3;
                auVar122._16_4_ = uVar3;
                auVar122._20_4_ = uVar3;
                auVar122._24_4_ = uVar3;
                auVar122._28_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar122,ZEXT1632(auVar139),pauVar31[5]);
                auVar137 = ZEXT1664(auVar113);
                uVar3 = puVar28[6];
                auVar317._4_4_ = uVar3;
                auVar317._0_4_ = uVar3;
                auVar317._8_4_ = uVar3;
                auVar317._12_4_ = uVar3;
                auVar317._16_4_ = uVar3;
                auVar317._20_4_ = uVar3;
                auVar317._24_4_ = uVar3;
                auVar317._28_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar317,ZEXT1632(auVar213),pauVar31[6]);
                auVar320 = ZEXT1664(auVar113);
                uVar3 = puVar28[7];
                auVar238._4_4_ = uVar3;
                auVar238._0_4_ = uVar3;
                auVar238._8_4_ = uVar3;
                auVar238._12_4_ = uVar3;
                auVar238._16_4_ = uVar3;
                auVar238._20_4_ = uVar3;
                auVar238._24_4_ = uVar3;
                auVar238._28_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar238,ZEXT1632(auVar220),pauVar31[7]);
                auVar247 = ZEXT1664(auVar113);
                pauVar31 = pauVar31 + 8;
                puVar28 = puVar28 + lVar44;
              }
              pauVar53 = pauVar53 + uVar75 * 8;
            }
            else {
              puVar28 = (undefined4 *)((long)local_88.data + lVar27 + (long)iVar19 * 4);
            }
            if (local_88.elempack == 4) {
              puVar55 = puVar28 + 3;
              uVar45 = uVar75;
              pauVar31 = pauVar53;
              while (iVar51 = (int)uVar45, uVar45 = (ulong)(iVar51 - 1), iVar51 != 0) {
                uVar3 = puVar55[-3];
                auVar145._4_4_ = uVar3;
                auVar145._0_4_ = uVar3;
                auVar145._8_4_ = uVar3;
                auVar145._12_4_ = uVar3;
                auVar145._16_4_ = uVar3;
                auVar145._20_4_ = uVar3;
                auVar145._24_4_ = uVar3;
                auVar145._28_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar145,auVar110._0_32_,*pauVar31);
                uVar3 = puVar55[-2];
                auVar250._4_4_ = uVar3;
                auVar250._0_4_ = uVar3;
                auVar250._8_4_ = uVar3;
                auVar250._12_4_ = uVar3;
                auVar250._16_4_ = uVar3;
                auVar250._20_4_ = uVar3;
                auVar250._24_4_ = uVar3;
                auVar250._28_4_ = uVar3;
                auVar139 = vfmadd132ps_fma(auVar250,auVar137._0_32_,pauVar31[1]);
                uVar3 = puVar55[-1];
                auVar268._4_4_ = uVar3;
                auVar268._0_4_ = uVar3;
                auVar268._8_4_ = uVar3;
                auVar268._12_4_ = uVar3;
                auVar268._16_4_ = uVar3;
                auVar268._20_4_ = uVar3;
                auVar268._24_4_ = uVar3;
                auVar268._28_4_ = uVar3;
                auVar213 = vfmadd132ps_fma(auVar268,auVar320._0_32_,pauVar31[2]);
                uVar3 = *puVar55;
                auVar281._4_4_ = uVar3;
                auVar281._0_4_ = uVar3;
                auVar281._8_4_ = uVar3;
                auVar281._12_4_ = uVar3;
                auVar281._16_4_ = uVar3;
                auVar281._20_4_ = uVar3;
                auVar281._24_4_ = uVar3;
                auVar281._28_4_ = uVar3;
                auVar220 = vfmadd132ps_fma(auVar281,auVar247._0_32_,pauVar31[3]);
                uVar3 = puVar55[lVar47 + -3];
                auVar104._4_4_ = uVar3;
                auVar104._0_4_ = uVar3;
                auVar104._8_4_ = uVar3;
                auVar104._12_4_ = uVar3;
                auVar104._16_4_ = uVar3;
                auVar104._20_4_ = uVar3;
                auVar104._24_4_ = uVar3;
                auVar104._28_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar104,ZEXT1632(auVar113),pauVar31[4]);
                auVar110 = ZEXT1664(auVar113);
                uVar3 = puVar55[lVar47 + -2];
                auVar123._4_4_ = uVar3;
                auVar123._0_4_ = uVar3;
                auVar123._8_4_ = uVar3;
                auVar123._12_4_ = uVar3;
                auVar123._16_4_ = uVar3;
                auVar123._20_4_ = uVar3;
                auVar123._24_4_ = uVar3;
                auVar123._28_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar123,ZEXT1632(auVar139),pauVar31[5]);
                auVar137 = ZEXT1664(auVar113);
                uVar3 = puVar55[lVar47 + -1];
                auVar318._4_4_ = uVar3;
                auVar318._0_4_ = uVar3;
                auVar318._8_4_ = uVar3;
                auVar318._12_4_ = uVar3;
                auVar318._16_4_ = uVar3;
                auVar318._20_4_ = uVar3;
                auVar318._24_4_ = uVar3;
                auVar318._28_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar318,ZEXT1632(auVar213),pauVar31[6]);
                auVar320 = ZEXT1664(auVar113);
                uVar3 = puVar55[lVar47];
                auVar239._4_4_ = uVar3;
                auVar239._0_4_ = uVar3;
                auVar239._8_4_ = uVar3;
                auVar239._12_4_ = uVar3;
                auVar239._16_4_ = uVar3;
                auVar239._20_4_ = uVar3;
                auVar239._24_4_ = uVar3;
                auVar239._28_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar239,ZEXT1632(auVar220),pauVar31[7]);
                auVar247 = ZEXT1664(auVar113);
                pauVar31 = pauVar31 + 8;
                puVar55 = puVar55 + lVar38;
              }
              pauVar53 = pauVar53 + uVar75 * 8;
              puVar28 = puVar28 + lVar38 * uVar75;
            }
            uVar45 = uVar75;
            pauVar31 = pauVar53;
            if (local_88.elempack == 1) {
              while ((int)uVar45 != 0) {
                uVar3 = *puVar28;
                auVar146._4_4_ = uVar3;
                auVar146._0_4_ = uVar3;
                auVar146._8_4_ = uVar3;
                auVar146._12_4_ = uVar3;
                auVar146._16_4_ = uVar3;
                auVar146._20_4_ = uVar3;
                auVar146._24_4_ = uVar3;
                auVar146._28_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar146,auVar110._0_32_,*pauVar31);
                uVar3 = puVar28[lVar47];
                auVar251._4_4_ = uVar3;
                auVar251._0_4_ = uVar3;
                auVar251._8_4_ = uVar3;
                auVar251._12_4_ = uVar3;
                auVar251._16_4_ = uVar3;
                auVar251._20_4_ = uVar3;
                auVar251._24_4_ = uVar3;
                auVar251._28_4_ = uVar3;
                auVar139 = vfmadd132ps_fma(auVar251,auVar137._0_32_,pauVar31[1]);
                uVar3 = puVar28[lVar72];
                auVar269._4_4_ = uVar3;
                auVar269._0_4_ = uVar3;
                auVar269._8_4_ = uVar3;
                auVar269._12_4_ = uVar3;
                auVar269._16_4_ = uVar3;
                auVar269._20_4_ = uVar3;
                auVar269._24_4_ = uVar3;
                auVar269._28_4_ = uVar3;
                auVar213 = vfmadd132ps_fma(auVar269,auVar320._0_32_,pauVar31[2]);
                uVar3 = puVar28[lVar73];
                auVar282._4_4_ = uVar3;
                auVar282._0_4_ = uVar3;
                auVar282._8_4_ = uVar3;
                auVar282._12_4_ = uVar3;
                auVar282._16_4_ = uVar3;
                auVar282._20_4_ = uVar3;
                auVar282._24_4_ = uVar3;
                auVar282._28_4_ = uVar3;
                auVar220 = vfmadd132ps_fma(auVar282,auVar247._0_32_,pauVar31[3]);
                uVar3 = puVar28[lVar22];
                auVar105._4_4_ = uVar3;
                auVar105._0_4_ = uVar3;
                auVar105._8_4_ = uVar3;
                auVar105._12_4_ = uVar3;
                auVar105._16_4_ = uVar3;
                auVar105._20_4_ = uVar3;
                auVar105._24_4_ = uVar3;
                auVar105._28_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar105,ZEXT1632(auVar113),pauVar31[4]);
                auVar110 = ZEXT1664(auVar113);
                uVar3 = puVar28[lVar23];
                auVar124._4_4_ = uVar3;
                auVar124._0_4_ = uVar3;
                auVar124._8_4_ = uVar3;
                auVar124._12_4_ = uVar3;
                auVar124._16_4_ = uVar3;
                auVar124._20_4_ = uVar3;
                auVar124._24_4_ = uVar3;
                auVar124._28_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar124,ZEXT1632(auVar139),pauVar31[5]);
                auVar137 = ZEXT1664(auVar113);
                uVar3 = puVar28[lVar24];
                auVar319._4_4_ = uVar3;
                auVar319._0_4_ = uVar3;
                auVar319._8_4_ = uVar3;
                auVar319._12_4_ = uVar3;
                auVar319._16_4_ = uVar3;
                auVar319._20_4_ = uVar3;
                auVar319._24_4_ = uVar3;
                auVar319._28_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar319,ZEXT1632(auVar213),pauVar31[6]);
                auVar320 = ZEXT1664(auVar113);
                uVar3 = puVar28[lVar25];
                auVar240._4_4_ = uVar3;
                auVar240._0_4_ = uVar3;
                auVar240._8_4_ = uVar3;
                auVar240._12_4_ = uVar3;
                auVar240._16_4_ = uVar3;
                auVar240._20_4_ = uVar3;
                auVar240._24_4_ = uVar3;
                auVar240._28_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar240,ZEXT1632(auVar220),pauVar31[7]);
                auVar247 = ZEXT1664(auVar113);
                puVar28 = puVar28 + lVar48;
                uVar45 = (ulong)((int)uVar45 - 1);
                pauVar31 = pauVar31 + 8;
              }
              pauVar53 = pauVar53 + uVar75 * 8;
            }
            uVar60 = uVar60 + 8;
            lVar66 = lVar66 + lVar39 * 8;
            puVar69 = puVar69 + lVar39 * 2;
          }
          for (; (int)((uint)uVar60 | 3) < local_220; uVar60 = uVar60 + 4) {
            lVar27 = (int)((long)((ulong)(uint)((int)(uint)uVar60 >> 0x1f) << 0x20 |
                                 uVar60 & 0xffffffff) / (long)local_88.elempack) * lVar39;
            if (local_88.elempack == 4) {
              puVar28 = (undefined4 *)((long)local_88.data + lVar27 + (long)iVar50 * 4);
              uVar45 = uVar75;
              pauVar31 = pauVar53;
              while (iVar51 = (int)uVar45, uVar45 = (ulong)(iVar51 - 1), iVar51 != 0) {
                uVar3 = *puVar28;
                auVar147._4_4_ = uVar3;
                auVar147._0_4_ = uVar3;
                auVar147._8_4_ = uVar3;
                auVar147._12_4_ = uVar3;
                auVar147._16_4_ = uVar3;
                auVar147._20_4_ = uVar3;
                auVar147._24_4_ = uVar3;
                auVar147._28_4_ = uVar3;
                auVar113 = vfmadd231ps_fma(auVar110._0_32_,auVar147,*pauVar31);
                auVar110 = ZEXT1664(auVar113);
                uVar3 = puVar28[1];
                auVar81._4_4_ = uVar3;
                auVar81._0_4_ = uVar3;
                auVar81._8_4_ = uVar3;
                auVar81._12_4_ = uVar3;
                auVar81._16_4_ = uVar3;
                auVar81._20_4_ = uVar3;
                auVar81._24_4_ = uVar3;
                auVar81._28_4_ = uVar3;
                auVar113 = vfmadd231ps_fma(auVar137._0_32_,auVar81,pauVar31[1]);
                auVar137 = ZEXT1664(auVar113);
                uVar3 = puVar28[2];
                auVar148._4_4_ = uVar3;
                auVar148._0_4_ = uVar3;
                auVar148._8_4_ = uVar3;
                auVar148._12_4_ = uVar3;
                auVar148._16_4_ = uVar3;
                auVar148._20_4_ = uVar3;
                auVar148._24_4_ = uVar3;
                auVar148._28_4_ = uVar3;
                auVar113 = vfmadd231ps_fma(auVar320._0_32_,auVar148,pauVar31[2]);
                auVar320 = ZEXT1664(auVar113);
                uVar3 = puVar28[3];
                auVar149._4_4_ = uVar3;
                auVar149._0_4_ = uVar3;
                auVar149._8_4_ = uVar3;
                auVar149._12_4_ = uVar3;
                auVar149._16_4_ = uVar3;
                auVar149._20_4_ = uVar3;
                auVar149._24_4_ = uVar3;
                auVar149._28_4_ = uVar3;
                auVar113 = vfmadd231ps_fma(auVar247._0_32_,auVar149,pauVar31[3]);
                auVar247 = ZEXT1664(auVar113);
                pauVar31 = pauVar31 + 4;
                puVar28 = puVar28 + lVar38;
              }
              pauVar53 = pauVar53 + uVar75 * 4;
            }
            else {
              puVar28 = (undefined4 *)((long)local_88.data + lVar27 + (long)iVar19 * 4);
            }
            uVar45 = uVar75;
            pauVar31 = pauVar53;
            if (local_88.elempack == 1) {
              while ((int)uVar45 != 0) {
                uVar3 = *puVar28;
                auVar150._4_4_ = uVar3;
                auVar150._0_4_ = uVar3;
                auVar150._8_4_ = uVar3;
                auVar150._12_4_ = uVar3;
                auVar150._16_4_ = uVar3;
                auVar150._20_4_ = uVar3;
                auVar150._24_4_ = uVar3;
                auVar150._28_4_ = uVar3;
                auVar113 = vfmadd231ps_fma(auVar110._0_32_,auVar150,*pauVar31);
                auVar110 = ZEXT1664(auVar113);
                uVar3 = puVar28[lVar47];
                auVar151._4_4_ = uVar3;
                auVar151._0_4_ = uVar3;
                auVar151._8_4_ = uVar3;
                auVar151._12_4_ = uVar3;
                auVar151._16_4_ = uVar3;
                auVar151._20_4_ = uVar3;
                auVar151._24_4_ = uVar3;
                auVar151._28_4_ = uVar3;
                auVar113 = vfmadd231ps_fma(auVar137._0_32_,auVar151,pauVar31[1]);
                auVar137 = ZEXT1664(auVar113);
                uVar3 = puVar28[lVar72];
                auVar152._4_4_ = uVar3;
                auVar152._0_4_ = uVar3;
                auVar152._8_4_ = uVar3;
                auVar152._12_4_ = uVar3;
                auVar152._16_4_ = uVar3;
                auVar152._20_4_ = uVar3;
                auVar152._24_4_ = uVar3;
                auVar152._28_4_ = uVar3;
                auVar113 = vfmadd231ps_fma(auVar320._0_32_,auVar152,pauVar31[2]);
                auVar320 = ZEXT1664(auVar113);
                uVar3 = puVar28[lVar73];
                auVar153._4_4_ = uVar3;
                auVar153._0_4_ = uVar3;
                auVar153._8_4_ = uVar3;
                auVar153._12_4_ = uVar3;
                auVar153._16_4_ = uVar3;
                auVar153._20_4_ = uVar3;
                auVar153._24_4_ = uVar3;
                auVar153._28_4_ = uVar3;
                auVar113 = vfmadd231ps_fma(auVar247._0_32_,auVar153,pauVar31[3]);
                auVar247 = ZEXT1664(auVar113);
                puVar28 = puVar28 + lVar48;
                uVar45 = (ulong)((int)uVar45 - 1);
                pauVar31 = pauVar31 + 4;
              }
              pauVar53 = pauVar53 + uVar75 * 4;
            }
            lVar66 = lVar66 + lVar39 * 4;
            puVar69 = puVar69 + lVar39;
          }
          for (; (long)(uVar60 | 1) < lVar59; uVar60 = uVar60 + 2) {
            lVar27 = 0;
            uVar45 = uVar75;
            pauVar31 = pauVar53;
            while (iVar19 = (int)uVar45, uVar45 = (ulong)(iVar19 - 1), iVar19 != 0) {
              uVar3 = *(undefined4 *)((long)puVar69 + lVar27);
              auVar154._4_4_ = uVar3;
              auVar154._0_4_ = uVar3;
              auVar154._8_4_ = uVar3;
              auVar154._12_4_ = uVar3;
              auVar154._16_4_ = uVar3;
              auVar154._20_4_ = uVar3;
              auVar154._24_4_ = uVar3;
              auVar154._28_4_ = uVar3;
              auVar113 = vfmadd231ps_fma(auVar110._0_32_,auVar154,*pauVar31);
              auVar110 = ZEXT1664(auVar113);
              uVar3 = *(undefined4 *)(lVar66 + lVar27);
              auVar155._4_4_ = uVar3;
              auVar155._0_4_ = uVar3;
              auVar155._8_4_ = uVar3;
              auVar155._12_4_ = uVar3;
              auVar155._16_4_ = uVar3;
              auVar155._20_4_ = uVar3;
              auVar155._24_4_ = uVar3;
              auVar155._28_4_ = uVar3;
              auVar113 = vfmadd231ps_fma(auVar137._0_32_,auVar155,pauVar31[1]);
              auVar137 = ZEXT1664(auVar113);
              pauVar31 = pauVar31 + 2;
              lVar27 = lVar27 + lVar49;
            }
            pauVar53 = pauVar53 + uVar75 * 2;
            lVar66 = lVar66 + lVar39 * 2;
            puVar69 = (undefined4 *)((long)puVar69 + lVar39 * 2);
          }
          for (; uVar45 = uVar75, puVar28 = puVar69, pauVar31 = pauVar53, (long)uVar60 < lVar59;
              uVar60 = uVar60 + 1) {
            while ((int)uVar45 != 0) {
              uVar3 = *puVar28;
              auVar156._4_4_ = uVar3;
              auVar156._0_4_ = uVar3;
              auVar156._8_4_ = uVar3;
              auVar156._12_4_ = uVar3;
              auVar156._16_4_ = uVar3;
              auVar156._20_4_ = uVar3;
              auVar156._24_4_ = uVar3;
              auVar156._28_4_ = uVar3;
              auVar113 = vfmadd231ps_fma(auVar110._0_32_,auVar156,*pauVar31);
              auVar110 = ZEXT1664(auVar113);
              uVar45 = (ulong)((int)uVar45 - 1);
              puVar28 = puVar28 + lVar48;
              pauVar31 = pauVar31 + 1;
            }
            pauVar53 = pauVar53 + uVar75;
            puVar69 = (undefined4 *)((long)puVar69 + lVar39);
          }
          fVar83 = auVar320._0_4_ + auVar247._0_4_ + auVar137._0_4_ + auVar110._0_4_;
          fVar111 = auVar320._4_4_ + auVar247._4_4_ + auVar137._4_4_ + auVar110._4_4_;
          auVar106._0_8_ = CONCAT44(fVar111,fVar83);
          auVar106._8_4_ = auVar320._8_4_ + auVar247._8_4_ + auVar137._8_4_ + auVar110._8_4_;
          auVar106._12_4_ = auVar320._12_4_ + auVar247._12_4_ + auVar137._12_4_ + auVar110._12_4_;
          auVar106._16_4_ = auVar320._16_4_ + auVar247._16_4_ + auVar137._16_4_ + auVar110._16_4_;
          auVar106._20_4_ = auVar320._20_4_ + auVar247._20_4_ + auVar137._20_4_ + auVar110._20_4_;
          auVar106._24_4_ = auVar320._24_4_ + auVar247._24_4_ + auVar137._24_4_ + auVar110._24_4_;
          auVar106._28_4_ = auVar320._28_4_ + auVar247._28_4_ + auVar137._28_4_ + auVar110._28_4_;
          auVar147 = auVar106;
          if (5 < iVar6 - 1U) goto switchD_0049a13b_caseD_1;
          auVar81 = auVar82._0_32_;
          auVar147 = vmaxps_avx(auVar106,auVar81);
          auVar148 = auVar177._0_32_;
          switch(iVar6) {
          case 2:
            auVar81 = vminps_avx(auVar106,auVar81);
            uVar3 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var7);
            auVar157._4_4_ = uVar3;
            auVar157._0_4_ = uVar3;
            auVar157._8_4_ = uVar3;
            auVar157._12_4_ = uVar3;
            auVar157._16_4_ = uVar3;
            auVar157._20_4_ = uVar3;
            auVar157._24_4_ = uVar3;
            auVar157._28_4_ = uVar3;
            auVar113 = vfmadd231ps_fma(auVar147,auVar81,auVar157);
            auVar147 = ZEXT1632(auVar113);
            break;
          case 3:
            uVar3 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var7);
            auVar129._4_4_ = uVar3;
            auVar129._0_4_ = uVar3;
            auVar129._8_4_ = uVar3;
            auVar129._12_4_ = uVar3;
            auVar129._16_4_ = uVar3;
            auVar129._20_4_ = uVar3;
            auVar129._24_4_ = uVar3;
            auVar129._28_4_ = uVar3;
            uVar3 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var7))[1];
            auVar163._4_4_ = uVar3;
            auVar163._0_4_ = uVar3;
            auVar163._8_4_ = uVar3;
            auVar163._12_4_ = uVar3;
            auVar163._16_4_ = uVar3;
            auVar163._20_4_ = uVar3;
            auVar163._24_4_ = uVar3;
            auVar163._28_4_ = uVar3;
            auVar147 = vmaxps_avx(auVar106,auVar129);
            auVar147 = vminps_avx(auVar147,auVar163);
            break;
          case 4:
            auVar107._0_8_ = auVar106._0_8_ ^ 0x8000000080000000;
            auVar107._8_4_ = -auVar106._8_4_;
            auVar107._12_4_ = -auVar106._12_4_;
            auVar107._16_4_ = -auVar106._16_4_;
            auVar107._20_4_ = -auVar106._20_4_;
            auVar107._24_4_ = -auVar106._24_4_;
            auVar107._28_4_ = -auVar106._28_4_;
            auVar130._8_4_ = 0x42b0c0a5;
            auVar130._0_8_ = 0x42b0c0a542b0c0a5;
            auVar130._12_4_ = 0x42b0c0a5;
            auVar130._16_4_ = 0x42b0c0a5;
            auVar130._20_4_ = 0x42b0c0a5;
            auVar130._24_4_ = 0x42b0c0a5;
            auVar130._28_4_ = 0x42b0c0a5;
            auVar147 = vminps_avx(auVar107,auVar130);
            auVar131._8_4_ = 0xc2b0c0a5;
            auVar131._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar131._12_4_ = 0xc2b0c0a5;
            auVar131._16_4_ = 0xc2b0c0a5;
            auVar131._20_4_ = 0xc2b0c0a5;
            auVar131._24_4_ = 0xc2b0c0a5;
            auVar131._28_4_ = 0xc2b0c0a5;
            auVar81 = vmaxps_avx(auVar147,auVar131);
            auVar132._8_4_ = 0x3fb8aa3b;
            auVar132._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar132._12_4_ = 0x3fb8aa3b;
            auVar132._16_4_ = 0x3fb8aa3b;
            auVar132._20_4_ = 0x3fb8aa3b;
            auVar132._24_4_ = 0x3fb8aa3b;
            auVar132._28_4_ = 0x3fb8aa3b;
            auVar113 = vfmadd213ps_fma(auVar132,auVar81,auVar148);
            auVar149 = vroundps_avx(ZEXT1632(auVar113),1);
            auVar147 = vcmpps_avx(ZEXT1632(auVar113),auVar149,1);
            auVar147 = vandps_avx(auVar147,auVar214);
            auVar147 = vsubps_avx(auVar149,auVar147);
            auVar164._8_4_ = 0x3f318000;
            auVar164._0_8_ = 0x3f3180003f318000;
            auVar164._12_4_ = 0x3f318000;
            auVar164._16_4_ = 0x3f318000;
            auVar164._20_4_ = 0x3f318000;
            auVar164._24_4_ = 0x3f318000;
            auVar164._28_4_ = 0x3f318000;
            auVar113 = vfmsub231ps_fma(auVar81,auVar147,auVar164);
            auVar165._8_4_ = 0x395e8083;
            auVar165._0_8_ = 0x395e8083395e8083;
            auVar165._12_4_ = 0x395e8083;
            auVar165._16_4_ = 0x395e8083;
            auVar165._20_4_ = 0x395e8083;
            auVar165._24_4_ = 0x395e8083;
            auVar165._28_4_ = 0x395e8083;
            auVar139 = vfmsub231ps_fma(ZEXT1632(auVar113),auVar147,auVar165);
            auVar81 = ZEXT1632(auVar139);
            auVar17._28_4_ = 0x395e8083;
            auVar17._0_28_ =
                 ZEXT1628(CONCAT412(auVar139._12_4_ * auVar139._12_4_,
                                    CONCAT48(auVar139._8_4_ * auVar139._8_4_,
                                             CONCAT44(auVar139._4_4_ * auVar139._4_4_,
                                                      auVar139._0_4_ * auVar139._0_4_))));
            auVar246._8_4_ = 0x39506967;
            auVar246._0_8_ = 0x3950696739506967;
            auVar246._12_4_ = 0x39506967;
            auVar246._16_4_ = 0x39506967;
            auVar246._20_4_ = 0x39506967;
            auVar246._24_4_ = 0x39506967;
            auVar246._28_4_ = 0x39506967;
            auVar209._8_4_ = 0x3ab743ce;
            auVar209._0_8_ = 0x3ab743ce3ab743ce;
            auVar209._12_4_ = 0x3ab743ce;
            auVar209._16_4_ = 0x3ab743ce;
            auVar209._20_4_ = 0x3ab743ce;
            auVar209._24_4_ = 0x3ab743ce;
            auVar209._28_4_ = 0x3ab743ce;
            auVar113 = vfmadd213ps_fma(auVar246,auVar81,auVar209);
            auVar210._8_4_ = 0x3c088908;
            auVar210._0_8_ = 0x3c0889083c088908;
            auVar210._12_4_ = 0x3c088908;
            auVar210._16_4_ = 0x3c088908;
            auVar210._20_4_ = 0x3c088908;
            auVar210._24_4_ = 0x3c088908;
            auVar210._28_4_ = 0x3c088908;
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar81,auVar210);
            auVar211._8_4_ = 0x3d2aa9c1;
            auVar211._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar211._12_4_ = 0x3d2aa9c1;
            auVar211._16_4_ = 0x3d2aa9c1;
            auVar211._20_4_ = 0x3d2aa9c1;
            auVar211._24_4_ = 0x3d2aa9c1;
            auVar211._28_4_ = 0x3d2aa9c1;
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar81,auVar211);
            auVar212._8_4_ = 0x3e2aaaaa;
            auVar212._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar212._12_4_ = 0x3e2aaaaa;
            auVar212._16_4_ = 0x3e2aaaaa;
            auVar212._20_4_ = 0x3e2aaaaa;
            auVar212._24_4_ = 0x3e2aaaaa;
            auVar212._28_4_ = 0x3e2aaaaa;
            auVar81 = ZEXT1632(auVar139);
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar81,auVar212);
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar81,auVar148);
            auVar213 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar17,auVar81);
            auVar84._0_4_ = (int)auVar147._0_4_;
            auVar84._4_4_ = (int)auVar147._4_4_;
            auVar84._8_4_ = (int)auVar147._8_4_;
            auVar84._12_4_ = (int)auVar147._12_4_;
            auVar108._16_4_ = (int)auVar147._16_4_;
            auVar108._0_16_ = auVar84;
            auVar108._20_4_ = (int)auVar147._20_4_;
            auVar108._24_4_ = (int)auVar147._24_4_;
            auVar108._28_4_ = (int)auVar147._28_4_;
            auVar139 = vpslld_avx(auVar84,0x17);
            auVar113 = vpslld_avx(auVar108._16_16_,0x17);
            auVar140._8_4_ = 0x3f800000;
            auVar140._0_8_ = 0x3f8000003f800000;
            auVar140._12_4_ = 0x3f800000;
            auVar113 = vpaddd_avx(auVar113,auVar140);
            auVar139 = vpaddd_avx(auVar139,auVar140);
            auVar133._16_16_ = auVar113;
            auVar133._0_16_ = auVar139;
            auVar109._0_4_ = auVar213._0_4_ + 1.0;
            auVar109._4_4_ = auVar213._4_4_ + 1.0;
            auVar109._8_4_ = auVar213._8_4_ + 1.0;
            auVar109._12_4_ = auVar213._12_4_ + 1.0;
            auVar109._16_4_ = 0x3f800000;
            auVar109._20_4_ = 0x3f800000;
            auVar109._24_4_ = 0x3f800000;
            auVar109._28_4_ = 0x3f800000;
            auVar113 = vfmadd213ps_fma(auVar133,auVar109,auVar214);
            auVar147 = vrcpps_avx(ZEXT1632(auVar113));
            auVar113 = vfmsub213ps_fma(ZEXT1632(auVar113),auVar147,auVar214);
            auVar113 = vfnmadd132ps_fma(ZEXT1632(auVar113),auVar147,auVar147);
            auVar147 = ZEXT1632(auVar113);
            break;
          case 5:
            auVar147 = vminps_avx(auVar299,auVar106);
            auVar81 = vmaxps_avx(auVar311,auVar147);
            auVar158._8_4_ = 0x3fb8aa3b;
            auVar158._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar158._12_4_ = 0x3fb8aa3b;
            auVar158._16_4_ = 0x3fb8aa3b;
            auVar158._20_4_ = 0x3fb8aa3b;
            auVar158._24_4_ = 0x3fb8aa3b;
            auVar158._28_4_ = 0x3fb8aa3b;
            auVar113 = vfmadd213ps_fma(auVar158,auVar81,auVar148);
            auVar149 = vroundps_avx(ZEXT1632(auVar113),1);
            auVar147 = vcmpps_avx(ZEXT1632(auVar113),auVar149,1);
            auVar147 = vandps_avx(auVar147,auVar214);
            auVar147 = vsubps_avx(auVar149,auVar147);
            auVar176._8_4_ = 0x3f318000;
            auVar176._0_8_ = 0x3f3180003f318000;
            auVar176._12_4_ = 0x3f318000;
            auVar176._16_4_ = 0x3f318000;
            auVar176._20_4_ = 0x3f318000;
            auVar176._24_4_ = 0x3f318000;
            auVar176._28_4_ = 0x3f318000;
            auVar113 = vfmsub231ps_fma(auVar81,auVar147,auVar176);
            auVar139 = vfnmsub231ps_fma(ZEXT1632(auVar113),auVar147,auVar254);
            auVar81 = ZEXT1632(auVar139);
            auVar14._28_4_ = auVar149._28_4_;
            auVar14._0_28_ =
                 ZEXT1628(CONCAT412(auVar139._12_4_ * auVar139._12_4_,
                                    CONCAT48(auVar139._8_4_ * auVar139._8_4_,
                                             CONCAT44(auVar139._4_4_ * auVar139._4_4_,
                                                      auVar139._0_4_ * auVar139._0_4_))));
            auVar231._8_4_ = 0x39506967;
            auVar231._0_8_ = 0x3950696739506967;
            auVar231._12_4_ = 0x39506967;
            auVar231._16_4_ = 0x39506967;
            auVar231._20_4_ = 0x39506967;
            auVar231._24_4_ = 0x39506967;
            auVar231._28_4_ = 0x39506967;
            auVar207._8_4_ = 0x3ab743ce;
            auVar207._0_8_ = 0x3ab743ce3ab743ce;
            auVar207._12_4_ = 0x3ab743ce;
            auVar207._16_4_ = 0x3ab743ce;
            auVar207._20_4_ = 0x3ab743ce;
            auVar207._24_4_ = 0x3ab743ce;
            auVar207._28_4_ = 0x3ab743ce;
            auVar113 = vfmadd213ps_fma(auVar231,auVar81,auVar207);
            auVar270._8_4_ = 0x3c088908;
            auVar270._0_8_ = 0x3c0889083c088908;
            auVar270._12_4_ = 0x3c088908;
            auVar270._16_4_ = 0x3c088908;
            auVar270._20_4_ = 0x3c088908;
            auVar270._24_4_ = 0x3c088908;
            auVar270._28_4_ = 0x3c088908;
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar81,auVar270);
            auVar271._8_4_ = 0x3d2aa9c1;
            auVar271._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar271._12_4_ = 0x3d2aa9c1;
            auVar271._16_4_ = 0x3d2aa9c1;
            auVar271._20_4_ = 0x3d2aa9c1;
            auVar271._24_4_ = 0x3d2aa9c1;
            auVar271._28_4_ = 0x3d2aa9c1;
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar81,auVar271);
            auVar272._8_4_ = 0x3e2aaaaa;
            auVar272._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar272._12_4_ = 0x3e2aaaaa;
            auVar272._16_4_ = 0x3e2aaaaa;
            auVar272._20_4_ = 0x3e2aaaaa;
            auVar272._24_4_ = 0x3e2aaaaa;
            auVar272._28_4_ = 0x3e2aaaaa;
            auVar81 = ZEXT1632(auVar139);
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar81,auVar272);
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar81,auVar148);
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar14,auVar81);
            auVar241._0_4_ = auVar113._0_4_ + 1.0;
            auVar241._4_4_ = auVar113._4_4_ + 1.0;
            auVar241._8_4_ = auVar113._8_4_ + 1.0;
            auVar241._12_4_ = auVar113._12_4_ + 1.0;
            auVar241._16_4_ = 0x3f800000;
            auVar241._20_4_ = 0x3f800000;
            auVar241._24_4_ = 0x3f800000;
            auVar241._28_4_ = 0x3f800000;
            auVar113._0_4_ = (int)auVar147._0_4_;
            auVar113._4_4_ = (int)auVar147._4_4_;
            auVar113._8_4_ = (int)auVar147._8_4_;
            auVar113._12_4_ = (int)auVar147._12_4_;
            auVar125._16_4_ = (int)auVar147._16_4_;
            auVar125._0_16_ = auVar113;
            auVar125._20_4_ = (int)auVar147._20_4_;
            auVar125._24_4_ = (int)auVar147._24_4_;
            auVar125._28_4_ = (int)auVar147._28_4_;
            auVar139 = vpslld_avx(auVar113,0x17);
            auVar113 = vpslld_avx(auVar125._16_16_,0x17);
            auVar312._8_4_ = 0x3f800000;
            auVar312._0_8_ = 0x3f8000003f800000;
            auVar312._12_4_ = 0x3f800000;
            auVar113 = vpaddd_avx(auVar312,auVar113);
            auVar139 = vpaddd_avx(auVar312,auVar139);
            auVar126._16_16_ = auVar113;
            auVar126._0_16_ = auVar139;
            auVar213 = vfmadd213ps_fma(auVar126,auVar241,auVar214);
            auVar159._8_4_ = 0x800000;
            auVar159._0_8_ = 0x80000000800000;
            auVar159._12_4_ = 0x800000;
            auVar159._16_4_ = 0x800000;
            auVar159._20_4_ = 0x800000;
            auVar159._24_4_ = 0x800000;
            auVar159._28_4_ = 0x800000;
            auVar147 = vmaxps_avx(ZEXT1632(auVar213),auVar159);
            auVar139 = vpsrld_avx(auVar147._0_16_,0x17);
            auVar113 = vpsrld_avx(auVar147._16_16_,0x17);
            auVar242._8_4_ = 0x807fffff;
            auVar242._0_8_ = 0x807fffff807fffff;
            auVar242._12_4_ = 0x807fffff;
            auVar242._16_4_ = 0x807fffff;
            auVar242._20_4_ = 0x807fffff;
            auVar242._24_4_ = 0x807fffff;
            auVar242._28_4_ = 0x807fffff;
            auVar147 = vandps_avx(auVar242,auVar147);
            auVar149 = vorps_avx(auVar147,auVar148);
            auVar243._8_4_ = 0x3f3504f3;
            auVar243._0_8_ = 0x3f3504f33f3504f3;
            auVar243._12_4_ = 0x3f3504f3;
            auVar243._16_4_ = 0x3f3504f3;
            auVar243._20_4_ = 0x3f3504f3;
            auVar243._24_4_ = 0x3f3504f3;
            auVar243._28_4_ = 0x3f3504f3;
            auVar81 = vcmpps_avx(auVar243,auVar149,2);
            auVar147 = vandnps_avx(auVar81,auVar149);
            auVar208._8_4_ = 0xbf800000;
            auVar208._0_8_ = 0xbf800000bf800000;
            auVar208._12_4_ = 0xbf800000;
            auVar208._16_4_ = 0xbf800000;
            auVar208._20_4_ = 0xbf800000;
            auVar208._24_4_ = 0xbf800000;
            auVar208._28_4_ = 0xbf800000;
            auVar244._0_4_ = auVar147._0_4_ + auVar149._0_4_ + -1.0;
            auVar244._4_4_ = auVar147._4_4_ + auVar149._4_4_ + -1.0;
            auVar244._8_4_ = auVar147._8_4_ + auVar149._8_4_ + -1.0;
            auVar244._12_4_ = auVar147._12_4_ + auVar149._12_4_ + -1.0;
            auVar244._16_4_ = auVar147._16_4_ + auVar149._16_4_ + -1.0;
            auVar244._20_4_ = auVar147._20_4_ + auVar149._20_4_ + -1.0;
            auVar244._24_4_ = auVar147._24_4_ + auVar149._24_4_ + -1.0;
            auVar244._28_4_ = auVar147._28_4_ + auVar149._28_4_ + -1.0;
            auVar113 = vpsubd_avx(auVar113,auVar81._16_16_);
            auVar220._8_4_ = 0xffffff81;
            auVar220._0_8_ = 0xffffff81ffffff81;
            auVar220._12_4_ = 0xffffff81;
            auVar113 = vpaddd_avx(auVar220,auVar113);
            auVar139 = vpsubd_avx(auVar139,auVar81._0_16_);
            auVar139 = vpaddd_avx(auVar139,auVar220);
            auVar160._16_16_ = auVar113;
            auVar160._0_16_ = auVar139;
            auVar252._0_4_ = auVar244._0_4_ * auVar244._0_4_;
            auVar252._4_4_ = auVar244._4_4_ * auVar244._4_4_;
            auVar252._8_4_ = auVar244._8_4_ * auVar244._8_4_;
            auVar252._12_4_ = auVar244._12_4_ * auVar244._12_4_;
            auVar252._16_4_ = auVar244._16_4_ * auVar244._16_4_;
            auVar252._20_4_ = auVar244._20_4_ * auVar244._20_4_;
            auVar252._24_4_ = auVar244._24_4_ * auVar244._24_4_;
            auVar252._28_4_ = 0;
            auVar273._8_4_ = 0x3d9021bb;
            auVar273._0_8_ = 0x3d9021bb3d9021bb;
            auVar273._12_4_ = 0x3d9021bb;
            auVar273._16_4_ = 0x3d9021bb;
            auVar273._20_4_ = 0x3d9021bb;
            auVar273._24_4_ = 0x3d9021bb;
            auVar273._28_4_ = 0x3d9021bb;
            auVar283._8_4_ = 0xbdebd1b8;
            auVar283._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar283._12_4_ = 0xbdebd1b8;
            auVar283._16_4_ = 0xbdebd1b8;
            auVar283._20_4_ = 0xbdebd1b8;
            auVar283._24_4_ = 0xbdebd1b8;
            auVar283._28_4_ = 0xbdebd1b8;
            auVar113 = vfmadd213ps_fma(auVar273,auVar244,auVar283);
            auVar284._8_4_ = 0x3def251a;
            auVar284._0_8_ = 0x3def251a3def251a;
            auVar284._12_4_ = 0x3def251a;
            auVar284._16_4_ = 0x3def251a;
            auVar284._20_4_ = 0x3def251a;
            auVar284._24_4_ = 0x3def251a;
            auVar284._28_4_ = 0x3def251a;
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar244,auVar284);
            auVar285._8_4_ = 0xbdfe5d4f;
            auVar285._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar285._12_4_ = 0xbdfe5d4f;
            auVar285._16_4_ = 0xbdfe5d4f;
            auVar285._20_4_ = 0xbdfe5d4f;
            auVar285._24_4_ = 0xbdfe5d4f;
            auVar285._28_4_ = 0xbdfe5d4f;
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar244,auVar285);
            auVar286._8_4_ = 0x3e11e9bf;
            auVar286._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar286._12_4_ = 0x3e11e9bf;
            auVar286._16_4_ = 0x3e11e9bf;
            auVar286._20_4_ = 0x3e11e9bf;
            auVar286._24_4_ = 0x3e11e9bf;
            auVar286._28_4_ = 0x3e11e9bf;
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar244,auVar286);
            auVar287._8_4_ = 0xbe2aae50;
            auVar287._0_8_ = 0xbe2aae50be2aae50;
            auVar287._12_4_ = 0xbe2aae50;
            auVar287._16_4_ = 0xbe2aae50;
            auVar287._20_4_ = 0xbe2aae50;
            auVar287._24_4_ = 0xbe2aae50;
            auVar287._28_4_ = 0xbe2aae50;
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar244,auVar287);
            auVar288._8_4_ = 0x3e4cceac;
            auVar288._0_8_ = 0x3e4cceac3e4cceac;
            auVar288._12_4_ = 0x3e4cceac;
            auVar288._16_4_ = 0x3e4cceac;
            auVar288._20_4_ = 0x3e4cceac;
            auVar288._24_4_ = 0x3e4cceac;
            auVar288._28_4_ = 0x3e4cceac;
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar244,auVar288);
            auVar289._8_4_ = 0xbe7ffffc;
            auVar289._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar289._12_4_ = 0xbe7ffffc;
            auVar289._16_4_ = 0xbe7ffffc;
            auVar289._20_4_ = 0xbe7ffffc;
            auVar289._24_4_ = 0xbe7ffffc;
            auVar289._28_4_ = 0xbe7ffffc;
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar244,auVar289);
            auVar290._8_4_ = 0x3eaaaaaa;
            auVar290._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar290._12_4_ = 0x3eaaaaaa;
            auVar290._16_4_ = 0x3eaaaaaa;
            auVar290._20_4_ = 0x3eaaaaaa;
            auVar290._24_4_ = 0x3eaaaaaa;
            auVar290._28_4_ = 0x3eaaaaaa;
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar244,auVar290);
            auVar274._0_4_ = auVar252._0_4_ * auVar244._0_4_ * auVar113._0_4_;
            auVar274._4_4_ = auVar252._4_4_ * auVar244._4_4_ * auVar113._4_4_;
            auVar274._8_4_ = auVar252._8_4_ * auVar244._8_4_ * auVar113._8_4_;
            auVar274._12_4_ = auVar252._12_4_ * auVar244._12_4_ * auVar113._12_4_;
            auVar274._16_4_ = auVar252._16_4_ * auVar244._16_4_ * 0.0;
            auVar274._20_4_ = auVar252._20_4_ * auVar244._20_4_ * 0.0;
            auVar274._24_4_ = auVar252._24_4_ * auVar244._24_4_ * 0.0;
            auVar274._28_4_ = 0;
            auVar81 = vcvtdq2ps_avx(auVar160);
            auVar113 = vfmadd231ps_fma(auVar274,auVar81,auVar254);
            auVar113 = vfmsub231ps_fma(ZEXT1632(auVar113),auVar148,auVar252);
            auVar147 = vcmpps_avx(ZEXT1632(auVar213),_DAT_004ed9c0,2);
            auVar149 = vsubps_avx(ZEXT1632(auVar113),auVar244);
            auVar113 = vfmsub231ps_fma(auVar149,auVar176,auVar81);
            auVar275._8_4_ = 0xc0000000;
            auVar275._0_8_ = 0xc0000000c0000000;
            auVar275._12_4_ = 0xc0000000;
            auVar275._16_4_ = 0xc0000000;
            auVar275._20_4_ = 0xc0000000;
            auVar275._24_4_ = 0xc0000000;
            auVar275._28_4_ = 0xc0000000;
            auVar15._4_4_ = auVar113._4_4_ * -2.0;
            auVar15._0_4_ = auVar113._0_4_ * -2.0;
            auVar15._8_4_ = auVar113._8_4_ * -2.0;
            auVar15._12_4_ = auVar113._12_4_ * -2.0;
            auVar15._16_4_ = 0x80000000;
            auVar15._20_4_ = 0x80000000;
            auVar15._24_4_ = 0x80000000;
            auVar15._28_4_ = auVar81._28_4_;
            auVar245._8_4_ = 0x7fffffff;
            auVar245._0_8_ = 0x7fffffff7fffffff;
            auVar245._12_4_ = 0x7fffffff;
            auVar245._16_4_ = 0x7fffffff;
            auVar245._20_4_ = 0x7fffffff;
            auVar245._24_4_ = 0x7fffffff;
            auVar245._28_4_ = 0x7fffffff;
            auVar147 = vblendvps_avx(auVar15,auVar245,auVar147);
            auVar147 = vminps_avx(auVar299,auVar147);
            auVar81 = vmaxps_avx(auVar311,auVar147);
            auVar161._8_4_ = 0x3fb8aa3b;
            auVar161._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar161._12_4_ = 0x3fb8aa3b;
            auVar161._16_4_ = 0x3fb8aa3b;
            auVar161._20_4_ = 0x3fb8aa3b;
            auVar161._24_4_ = 0x3fb8aa3b;
            auVar161._28_4_ = 0x3fb8aa3b;
            auVar113 = vfmadd213ps_fma(auVar161,auVar81,auVar148);
            auVar149 = vroundps_avx(ZEXT1632(auVar113),1);
            auVar147 = vcmpps_avx(ZEXT1632(auVar113),auVar149,1);
            auVar147 = vandps_avx(auVar147,auVar214);
            auVar147 = vsubps_avx(auVar149,auVar147);
            auVar113 = vfmsub231ps_fma(auVar81,auVar147,auVar176);
            auVar177 = ZEXT3264(auVar148);
            auVar82 = ZEXT864(0) << 0x20;
            auVar139 = vfnmsub231ps_fma(ZEXT1632(auVar113),auVar147,auVar254);
            auVar81 = ZEXT1632(auVar139);
            auVar16._28_4_ = auVar149._28_4_;
            auVar16._0_28_ =
                 ZEXT1628(CONCAT412(auVar139._12_4_ * auVar139._12_4_,
                                    CONCAT48(auVar139._8_4_ * auVar139._8_4_,
                                             CONCAT44(auVar139._4_4_ * auVar139._4_4_,
                                                      auVar139._0_4_ * auVar139._0_4_))));
            auVar232._8_4_ = 0x3ab743ce;
            auVar232._0_8_ = 0x3ab743ce3ab743ce;
            auVar232._12_4_ = 0x3ab743ce;
            auVar232._16_4_ = 0x3ab743ce;
            auVar232._20_4_ = 0x3ab743ce;
            auVar232._24_4_ = 0x3ab743ce;
            auVar232._28_4_ = 0x3ab743ce;
            auVar113 = vfmadd213ps_fma(auVar231,auVar81,auVar232);
            auVar233._8_4_ = 0x3c088908;
            auVar233._0_8_ = 0x3c0889083c088908;
            auVar233._12_4_ = 0x3c088908;
            auVar233._16_4_ = 0x3c088908;
            auVar233._20_4_ = 0x3c088908;
            auVar233._24_4_ = 0x3c088908;
            auVar233._28_4_ = 0x3c088908;
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar81,auVar233);
            auVar234._8_4_ = 0x3d2aa9c1;
            auVar234._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar234._12_4_ = 0x3d2aa9c1;
            auVar234._16_4_ = 0x3d2aa9c1;
            auVar234._20_4_ = 0x3d2aa9c1;
            auVar234._24_4_ = 0x3d2aa9c1;
            auVar234._28_4_ = 0x3d2aa9c1;
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar81,auVar234);
            auVar235._8_4_ = 0x3e2aaaaa;
            auVar235._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar235._12_4_ = 0x3e2aaaaa;
            auVar235._16_4_ = 0x3e2aaaaa;
            auVar235._20_4_ = 0x3e2aaaaa;
            auVar235._24_4_ = 0x3e2aaaaa;
            auVar235._28_4_ = 0x3e2aaaaa;
            auVar81 = ZEXT1632(auVar139);
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar81,auVar235);
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar81,auVar148);
            auVar213 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar16,auVar81);
            auVar139._0_4_ = (int)auVar147._0_4_;
            auVar139._4_4_ = (int)auVar147._4_4_;
            auVar139._8_4_ = (int)auVar147._8_4_;
            auVar139._12_4_ = (int)auVar147._12_4_;
            auVar127._16_4_ = (int)auVar147._16_4_;
            auVar127._0_16_ = auVar139;
            auVar127._20_4_ = (int)auVar147._20_4_;
            auVar127._24_4_ = (int)auVar147._24_4_;
            auVar127._28_4_ = (int)auVar147._28_4_;
            auVar139 = vpslld_avx(auVar139,0x17);
            auVar113 = vpslld_avx(auVar127._16_16_,0x17);
            auVar113 = vpaddd_avx(auVar312,auVar113);
            auVar139 = vpaddd_avx(auVar312,auVar139);
            auVar128._16_16_ = auVar113;
            auVar128._0_16_ = auVar139;
            auVar162._0_4_ = auVar213._0_4_ + 1.0;
            auVar162._4_4_ = auVar213._4_4_ + 1.0;
            auVar162._8_4_ = auVar213._8_4_ + 1.0;
            auVar162._12_4_ = auVar213._12_4_ + 1.0;
            auVar162._16_4_ = 0x3f800000;
            auVar162._20_4_ = 0x3f800000;
            auVar162._24_4_ = 0x3f800000;
            auVar162._28_4_ = 0x3f800000;
            auVar113 = vfmadd213ps_fma(auVar128,auVar162,auVar214);
            auVar147 = vrcpps_avx(ZEXT1632(auVar113));
            auVar113 = vfmsub213ps_fma(ZEXT1632(auVar113),auVar147,auVar214);
            auVar113 = vfnmadd132ps_fma(ZEXT1632(auVar113),auVar147,auVar147);
            auVar113 = vfnmadd213ps_fma(ZEXT1632(auVar113),auVar275,auVar208);
            auVar110 = ZEXT1664(auVar113);
            goto LAB_0049a586;
          case 6:
            uVar3 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var7);
            auVar134._4_4_ = uVar3;
            auVar134._0_4_ = uVar3;
            auVar134._8_4_ = uVar3;
            auVar134._12_4_ = uVar3;
            auVar134._16_4_ = uVar3;
            auVar134._20_4_ = uVar3;
            auVar134._24_4_ = uVar3;
            auVar134._28_4_ = uVar3;
            uVar3 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var7))[1];
            auVar166._4_4_ = uVar3;
            auVar166._0_4_ = uVar3;
            auVar166._8_4_ = uVar3;
            auVar166._12_4_ = uVar3;
            auVar166._16_4_ = uVar3;
            auVar166._20_4_ = uVar3;
            auVar166._24_4_ = uVar3;
            auVar166._28_4_ = uVar3;
            auVar113 = vfmadd231ps_fma(auVar166,auVar106,auVar134);
            auVar147 = vmaxps_avx(ZEXT1632(auVar113),auVar81);
            auVar147 = vminps_avx(auVar147,auVar214);
            auVar110 = ZEXT3264(auVar147);
LAB_0049a586:
            auVar247._0_4_ = auVar110._0_4_ * fVar83;
            auVar247._4_4_ = auVar110._4_4_ * fVar111;
            auVar247._8_4_ = auVar110._8_4_ * auVar106._8_4_;
            auVar247._12_4_ = auVar110._12_4_ * auVar106._12_4_;
            auVar247._16_4_ = auVar110._16_4_ * auVar106._16_4_;
            auVar247._20_4_ = auVar110._20_4_ * auVar106._20_4_;
            auVar247._28_36_ = auVar110._28_36_;
            auVar247._24_4_ = auVar110._24_4_ * auVar106._24_4_;
            auVar147 = auVar247._0_32_;
          }
switchD_0049a13b_caseD_1:
          auVar139 = auVar147._16_16_;
          auVar113 = auVar147._0_16_;
          if (iVar74 == 1) {
            *(int *)*local_1f0 = auVar147._0_4_;
            uVar3 = vextractps_avx(auVar113,1);
            *(undefined4 *)((long)*local_1f0 + lVar63 * 4) = uVar3;
            uVar3 = vextractps_avx(auVar113,2);
            *(undefined4 *)((long)*local_1f0 + (long)(iVar36 * 2) * 4) = uVar3;
            uVar3 = vextractps_avx(auVar113,3);
            *(undefined4 *)((long)*local_1f0 + (long)(iVar36 * 3) * 4) = uVar3;
            *(int *)((long)*local_1f0 + (long)(iVar36 * 4) * 4) = auVar147._16_4_;
            uVar3 = vextractps_avx(auVar139,1);
            *(undefined4 *)((long)*local_1f0 + (long)(iVar36 * 5) * 4) = uVar3;
            uVar3 = vextractps_avx(auVar139,2);
            *(undefined4 *)((long)*local_1f0 + (long)(iVar36 * 6) * 4) = uVar3;
            uVar3 = vextractps_avx(auVar139,3);
            *(undefined4 *)((long)*local_1f0 + (long)(iVar36 * 7) * 4) = uVar3;
            local_1f0 = (undefined1 (*) [32])((long)*local_1f0 + 4);
          }
          else if (iVar74 == 4) {
            *(undefined1 (*) [16])*local_1f0 = auVar113;
            *(undefined1 (*) [16])((long)*local_1f0 + lVar63 * 4) = auVar139;
            local_1f0 = (undefined1 (*) [32])((long)*local_1f0 + 0x10);
          }
          else if (iVar74 == 8) {
            *local_1f0 = auVar147;
            local_1f0 = local_1f0 + 1;
          }
          iVar50 = iVar50 + local_88.elempack * iVar5;
          local_1f8 = local_1f8 + lVar2;
          local_1c8 = local_1c8 + lVar2;
        }
      }
      uVar26 = (long)(iVar52 + iVar34 * -8) / 4;
      lVar59 = lVar38 * uVar75 * 4;
      lVar66 = uVar75 * 0x10;
      uVar64 = 0;
      iVar50 = (int)uVar26;
      uVar58 = 0;
      if (0 < iVar50) {
        uVar58 = uVar26 & 0xffffffff;
      }
      auVar82 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar177 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar248._8_4_ = 0xc2b0c0a5;
      auVar248._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar248._12_4_ = 0xc2b0c0a5;
      auVar213._8_4_ = 0xb95e8083;
      auVar213._0_8_ = 0xb95e8083b95e8083;
      auVar213._12_4_ = 0xb95e8083;
      auVar253._8_4_ = 0x3ab743ce;
      auVar253._0_8_ = 0x3ab743ce3ab743ce;
      auVar253._12_4_ = 0x3ab743ce;
      for (; uVar64 != uVar58; uVar64 = uVar64 + 1) {
        uVar26 = (long)(iVar34 * 8) + uVar64 * 4;
        uVar43 = top_blob->w;
        iVar19 = top_blob->elempack;
        uVar42 = (int)uVar26 >> 0x1f;
        local_1c0 = (undefined1 (*) [16])
                    ((long)(int)((long)((ulong)uVar42 << 0x20 | uVar26 & 0xffffffff) / (long)iVar19)
                     * (long)(int)uVar43 * top_blob->elemsize + (long)top_blob->data);
        uVar70 = (ulong)uVar42 << 0x20 | uVar26 & 0xffffffff;
        lVar39 = (long)local_88.h * (long)local_88.elempack;
        lVar27 = 0;
        uVar60 = 0;
        if (0 < (int)uVar43) {
          uVar60 = (ulong)uVar43;
        }
        iVar51 = 0;
        lVar71 = lVar47 * 4;
        for (uVar45 = 0; uVar45 != uVar60; uVar45 = uVar45 + 1) {
          auVar110 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar113 = ZEXT816(0) << 0x40;
          if (lVar61 != 0) {
            auVar113 = *(undefined1 (*) [16])(lVar61 + uVar26 * 4);
          }
          auVar247 = ZEXT1664(auVar113);
          pauVar54 = (undefined1 (*) [16])
                     ((this->weight_data_tm).cstep *
                      (long)(((int)((long)uVar70 % 8) >> 2) + (int)((long)uVar70 / 8)) *
                      (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          iVar20 = local_88.elempack * iVar5 * (int)uVar45;
          lVar40 = (long)local_88.w *
                   CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
          lVar67 = (long)local_88.data + lVar71;
          puVar69 = (undefined4 *)((long)local_88.data + lVar27);
          uVar62 = 0;
          auVar137 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar320 = ZEXT1664(ZEXT816(0) << 0x40);
          while( true ) {
            local_220 = (int)lVar39;
            if (local_220 <= (int)((uint)uVar62 | 7)) break;
            lVar29 = (int)((long)((ulong)(uint)((int)(uint)uVar62 >> 0x1f) << 0x20 |
                                 uVar62 & 0xffffffff) / (long)local_88.elempack) * lVar40;
            if (local_88.elempack == 8) {
              puVar28 = (undefined4 *)((long)local_88.data + lVar29 + (long)iVar51 * 4);
              pauVar41 = pauVar54;
              uVar30 = uVar75;
              while (iVar35 = (int)uVar30, uVar30 = (ulong)(iVar35 - 1), iVar35 != 0) {
                uVar3 = *puVar28;
                auVar313._4_4_ = uVar3;
                auVar313._0_4_ = uVar3;
                auVar313._8_4_ = uVar3;
                auVar313._12_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar313,auVar247._0_16_,*pauVar41);
                uVar3 = puVar28[1];
                auVar255._4_4_ = uVar3;
                auVar255._0_4_ = uVar3;
                auVar255._8_4_ = uVar3;
                auVar255._12_4_ = uVar3;
                auVar139 = vfmadd132ps_fma(auVar255,auVar320._0_16_,pauVar41[1]);
                uVar3 = puVar28[2];
                auVar178._4_4_ = uVar3;
                auVar178._0_4_ = uVar3;
                auVar178._8_4_ = uVar3;
                auVar178._12_4_ = uVar3;
                auVar220 = vfmadd132ps_fma(auVar178,auVar137._0_16_,pauVar41[2]);
                uVar3 = puVar28[3];
                auVar215._4_4_ = uVar3;
                auVar215._0_4_ = uVar3;
                auVar215._8_4_ = uVar3;
                auVar215._12_4_ = uVar3;
                auVar312 = vfmadd132ps_fma(auVar215,auVar110._0_16_,pauVar41[3]);
                uVar3 = puVar28[4];
                auVar276._4_4_ = uVar3;
                auVar276._0_4_ = uVar3;
                auVar276._8_4_ = uVar3;
                auVar276._12_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar276,auVar113,pauVar41[4]);
                auVar247 = ZEXT1664(auVar113);
                uVar3 = puVar28[5];
                auVar300._4_4_ = uVar3;
                auVar300._0_4_ = uVar3;
                auVar300._8_4_ = uVar3;
                auVar300._12_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar300,auVar139,pauVar41[5]);
                auVar320 = ZEXT1664(auVar113);
                uVar3 = puVar28[6];
                auVar291._4_4_ = uVar3;
                auVar291._0_4_ = uVar3;
                auVar291._8_4_ = uVar3;
                auVar291._12_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar291,auVar220,pauVar41[6]);
                auVar137 = ZEXT1664(auVar113);
                uVar3 = puVar28[7];
                auVar169._4_4_ = uVar3;
                auVar169._0_4_ = uVar3;
                auVar169._8_4_ = uVar3;
                auVar169._12_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar169,auVar312,pauVar41[7]);
                auVar110 = ZEXT1664(auVar113);
                pauVar41 = pauVar41 + 8;
                puVar28 = puVar28 + lVar44;
              }
              pauVar54 = pauVar54 + uVar75 * 8;
            }
            else {
              puVar28 = (undefined4 *)((long)local_88.data + lVar29 + (long)iVar20 * 4);
            }
            if (local_88.elempack == 4) {
              puVar55 = puVar28 + 3;
              uVar30 = uVar75;
              pauVar41 = pauVar54;
              while (iVar35 = (int)uVar30, uVar30 = (ulong)(iVar35 - 1), iVar35 != 0) {
                uVar3 = puVar55[-3];
                auVar179._4_4_ = uVar3;
                auVar179._0_4_ = uVar3;
                auVar179._8_4_ = uVar3;
                auVar179._12_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar179,auVar247._0_16_,*pauVar41);
                uVar3 = puVar55[-2];
                auVar216._4_4_ = uVar3;
                auVar216._0_4_ = uVar3;
                auVar216._8_4_ = uVar3;
                auVar216._12_4_ = uVar3;
                auVar139 = vfmadd132ps_fma(auVar216,auVar320._0_16_,pauVar41[1]);
                uVar3 = puVar55[-1];
                auVar256._4_4_ = uVar3;
                auVar256._0_4_ = uVar3;
                auVar256._8_4_ = uVar3;
                auVar256._12_4_ = uVar3;
                auVar220 = vfmadd132ps_fma(auVar256,auVar137._0_16_,pauVar41[2]);
                uVar3 = *puVar55;
                auVar314._4_4_ = uVar3;
                auVar314._0_4_ = uVar3;
                auVar314._8_4_ = uVar3;
                auVar314._12_4_ = uVar3;
                auVar312 = vfmadd132ps_fma(auVar314,auVar110._0_16_,pauVar41[3]);
                uVar3 = puVar55[lVar47 + -3];
                auVar277._4_4_ = uVar3;
                auVar277._0_4_ = uVar3;
                auVar277._8_4_ = uVar3;
                auVar277._12_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar277,auVar113,pauVar41[4]);
                auVar247 = ZEXT1664(auVar113);
                uVar3 = puVar55[lVar47 + -2];
                auVar301._4_4_ = uVar3;
                auVar301._0_4_ = uVar3;
                auVar301._8_4_ = uVar3;
                auVar301._12_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar301,auVar139,pauVar41[5]);
                auVar320 = ZEXT1664(auVar113);
                uVar3 = puVar55[lVar47 + -1];
                auVar292._4_4_ = uVar3;
                auVar292._0_4_ = uVar3;
                auVar292._8_4_ = uVar3;
                auVar292._12_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar292,auVar220,pauVar41[6]);
                auVar137 = ZEXT1664(auVar113);
                uVar3 = puVar55[lVar47];
                auVar170._4_4_ = uVar3;
                auVar170._0_4_ = uVar3;
                auVar170._8_4_ = uVar3;
                auVar170._12_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar170,auVar312,pauVar41[7]);
                auVar110 = ZEXT1664(auVar113);
                pauVar41 = pauVar41 + 8;
                puVar55 = puVar55 + lVar38;
              }
              pauVar54 = pauVar54 + uVar75 * 8;
              puVar28 = (undefined4 *)((long)puVar28 + lVar59);
            }
            uVar30 = uVar75;
            pauVar41 = pauVar54;
            if (local_88.elempack == 1) {
              while ((int)uVar30 != 0) {
                uVar3 = *puVar28;
                auVar180._4_4_ = uVar3;
                auVar180._0_4_ = uVar3;
                auVar180._8_4_ = uVar3;
                auVar180._12_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar180,auVar247._0_16_,*pauVar41);
                uVar3 = puVar28[lVar47];
                auVar217._4_4_ = uVar3;
                auVar217._0_4_ = uVar3;
                auVar217._8_4_ = uVar3;
                auVar217._12_4_ = uVar3;
                auVar139 = vfmadd132ps_fma(auVar217,auVar320._0_16_,pauVar41[1]);
                uVar3 = puVar28[lVar72];
                auVar257._4_4_ = uVar3;
                auVar257._0_4_ = uVar3;
                auVar257._8_4_ = uVar3;
                auVar257._12_4_ = uVar3;
                auVar220 = vfmadd132ps_fma(auVar257,auVar137._0_16_,pauVar41[2]);
                uVar3 = puVar28[lVar73];
                auVar315._4_4_ = uVar3;
                auVar315._0_4_ = uVar3;
                auVar315._8_4_ = uVar3;
                auVar315._12_4_ = uVar3;
                auVar312 = vfmadd132ps_fma(auVar315,auVar110._0_16_,pauVar41[3]);
                uVar3 = puVar28[lVar22];
                auVar278._4_4_ = uVar3;
                auVar278._0_4_ = uVar3;
                auVar278._8_4_ = uVar3;
                auVar278._12_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar278,auVar113,pauVar41[4]);
                auVar247 = ZEXT1664(auVar113);
                uVar3 = puVar28[lVar23];
                auVar302._4_4_ = uVar3;
                auVar302._0_4_ = uVar3;
                auVar302._8_4_ = uVar3;
                auVar302._12_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar302,auVar139,pauVar41[5]);
                auVar320 = ZEXT1664(auVar113);
                uVar3 = puVar28[lVar24];
                auVar293._4_4_ = uVar3;
                auVar293._0_4_ = uVar3;
                auVar293._8_4_ = uVar3;
                auVar293._12_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar293,auVar220,pauVar41[6]);
                auVar137 = ZEXT1664(auVar113);
                uVar3 = puVar28[lVar25];
                auVar171._4_4_ = uVar3;
                auVar171._0_4_ = uVar3;
                auVar171._8_4_ = uVar3;
                auVar171._12_4_ = uVar3;
                auVar113 = vfmadd132ps_fma(auVar171,auVar312,pauVar41[7]);
                auVar110 = ZEXT1664(auVar113);
                puVar28 = puVar28 + lVar48;
                uVar30 = (ulong)((int)uVar30 - 1);
                pauVar41 = pauVar41 + 8;
              }
              pauVar54 = pauVar54 + uVar75 * 8;
            }
            uVar62 = uVar62 + 8;
            lVar67 = lVar67 + lVar40 * 8;
            puVar69 = puVar69 + lVar40 * 2;
          }
          for (; (int)((uint)uVar62 | 3) < local_220; uVar62 = uVar62 + 4) {
            lVar29 = (int)((long)((ulong)(uint)((int)(uint)uVar62 >> 0x1f) << 0x20 |
                                 uVar62 & 0xffffffff) / (long)local_88.elempack) * lVar40;
            if (local_88.elempack == 4) {
              puVar28 = (undefined4 *)((long)local_88.data + lVar29 + (long)iVar51 * 4);
              uVar30 = uVar75;
              pauVar41 = pauVar54;
              while (iVar35 = (int)uVar30, uVar30 = (ulong)(iVar35 - 1), iVar35 != 0) {
                uVar3 = *puVar28;
                auVar181._4_4_ = uVar3;
                auVar181._0_4_ = uVar3;
                auVar181._8_4_ = uVar3;
                auVar181._12_4_ = uVar3;
                auVar113 = vfmadd231ps_fma(auVar247._0_16_,auVar181,*pauVar41);
                auVar247 = ZEXT1664(auVar113);
                uVar3 = puVar28[1];
                auVar182._4_4_ = uVar3;
                auVar182._0_4_ = uVar3;
                auVar182._8_4_ = uVar3;
                auVar182._12_4_ = uVar3;
                auVar113 = vfmadd231ps_fma(auVar320._0_16_,auVar182,pauVar41[1]);
                auVar320 = ZEXT1664(auVar113);
                uVar3 = puVar28[2];
                auVar183._4_4_ = uVar3;
                auVar183._0_4_ = uVar3;
                auVar183._8_4_ = uVar3;
                auVar183._12_4_ = uVar3;
                auVar113 = vfmadd231ps_fma(auVar137._0_16_,auVar183,pauVar41[2]);
                auVar137 = ZEXT1664(auVar113);
                uVar3 = puVar28[3];
                auVar184._4_4_ = uVar3;
                auVar184._0_4_ = uVar3;
                auVar184._8_4_ = uVar3;
                auVar184._12_4_ = uVar3;
                auVar113 = vfmadd231ps_fma(auVar110._0_16_,auVar184,pauVar41[3]);
                auVar110 = ZEXT1664(auVar113);
                pauVar41 = pauVar41 + 4;
                puVar28 = puVar28 + lVar38;
              }
              pauVar54 = pauVar54 + uVar75 * 4;
            }
            else {
              puVar28 = (undefined4 *)((long)local_88.data + lVar29 + (long)iVar20 * 4);
            }
            uVar30 = uVar75;
            pauVar41 = pauVar54;
            if (local_88.elempack == 1) {
              while ((int)uVar30 != 0) {
                uVar3 = *puVar28;
                auVar185._4_4_ = uVar3;
                auVar185._0_4_ = uVar3;
                auVar185._8_4_ = uVar3;
                auVar185._12_4_ = uVar3;
                auVar113 = vfmadd231ps_fma(auVar247._0_16_,auVar185,*pauVar41);
                auVar247 = ZEXT1664(auVar113);
                uVar3 = puVar28[lVar47];
                auVar186._4_4_ = uVar3;
                auVar186._0_4_ = uVar3;
                auVar186._8_4_ = uVar3;
                auVar186._12_4_ = uVar3;
                auVar113 = vfmadd231ps_fma(auVar320._0_16_,auVar186,pauVar41[1]);
                auVar320 = ZEXT1664(auVar113);
                uVar3 = puVar28[lVar72];
                auVar187._4_4_ = uVar3;
                auVar187._0_4_ = uVar3;
                auVar187._8_4_ = uVar3;
                auVar187._12_4_ = uVar3;
                auVar113 = vfmadd231ps_fma(auVar137._0_16_,auVar187,pauVar41[2]);
                auVar137 = ZEXT1664(auVar113);
                uVar3 = puVar28[lVar73];
                auVar188._4_4_ = uVar3;
                auVar188._0_4_ = uVar3;
                auVar188._8_4_ = uVar3;
                auVar188._12_4_ = uVar3;
                auVar113 = vfmadd231ps_fma(auVar110._0_16_,auVar188,pauVar41[3]);
                auVar110 = ZEXT1664(auVar113);
                puVar28 = puVar28 + lVar48;
                uVar30 = (ulong)((int)uVar30 - 1);
                pauVar41 = pauVar41 + 4;
              }
              pauVar54 = pauVar54 + uVar75 * 4;
            }
            lVar67 = lVar67 + lVar40 * 4;
            puVar69 = puVar69 + lVar40;
          }
          for (; (long)(uVar62 | 1) < lVar39; uVar62 = uVar62 + 2) {
            lVar29 = 0;
            uVar30 = uVar75;
            pauVar41 = pauVar54;
            while (iVar20 = (int)uVar30, uVar30 = (ulong)(iVar20 - 1), iVar20 != 0) {
              uVar3 = *(undefined4 *)((long)puVar69 + lVar29);
              auVar189._4_4_ = uVar3;
              auVar189._0_4_ = uVar3;
              auVar189._8_4_ = uVar3;
              auVar189._12_4_ = uVar3;
              auVar113 = vfmadd231ps_fma(auVar247._0_16_,auVar189,*pauVar41);
              auVar247 = ZEXT1664(auVar113);
              uVar3 = *(undefined4 *)(lVar67 + lVar29);
              auVar190._4_4_ = uVar3;
              auVar190._0_4_ = uVar3;
              auVar190._8_4_ = uVar3;
              auVar190._12_4_ = uVar3;
              auVar113 = vfmadd231ps_fma(auVar320._0_16_,auVar190,pauVar41[1]);
              auVar320 = ZEXT1664(auVar113);
              pauVar41 = pauVar41 + 2;
              lVar29 = lVar29 + lVar49;
            }
            pauVar54 = pauVar54 + uVar75 * 2;
            lVar67 = lVar67 + lVar40 * 2;
            puVar69 = (undefined4 *)((long)puVar69 + lVar40 * 2);
          }
          for (; uVar30 = uVar75, puVar28 = puVar69, pauVar41 = pauVar54, (long)uVar62 < lVar39;
              uVar62 = uVar62 + 1) {
            while ((int)uVar30 != 0) {
              uVar3 = *puVar28;
              auVar191._4_4_ = uVar3;
              auVar191._0_4_ = uVar3;
              auVar191._8_4_ = uVar3;
              auVar191._12_4_ = uVar3;
              auVar113 = vfmadd231ps_fma(auVar247._0_16_,auVar191,*pauVar41);
              auVar247 = ZEXT1664(auVar113);
              uVar30 = (ulong)((int)uVar30 - 1);
              puVar28 = puVar28 + lVar48;
              pauVar41 = pauVar41 + 1;
            }
            pauVar54 = pauVar54 + uVar75;
            puVar69 = (undefined4 *)((long)puVar69 + lVar40);
          }
          auVar172._0_4_ = auVar137._0_4_ + auVar110._0_4_ + auVar320._0_4_ + auVar247._0_4_;
          auVar172._4_4_ = auVar137._4_4_ + auVar110._4_4_ + auVar320._4_4_ + auVar247._4_4_;
          auVar172._8_4_ = auVar137._8_4_ + auVar110._8_4_ + auVar320._8_4_ + auVar247._8_4_;
          auVar172._12_4_ = auVar137._12_4_ + auVar110._12_4_ + auVar320._12_4_ + auVar247._12_4_;
          auVar279 = auVar172;
          if (iVar6 - 1U < 6) {
            auVar113 = auVar82._0_16_;
            auVar279 = vmaxps_avx(auVar172,auVar113);
            auVar139 = auVar177._0_16_;
            switch(iVar6) {
            case 2:
              auVar113 = vminps_avx(auVar172,auVar113);
              uVar3 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var7);
              auVar192._4_4_ = uVar3;
              auVar192._0_4_ = uVar3;
              auVar192._8_4_ = uVar3;
              auVar192._12_4_ = uVar3;
              auVar279 = vfmadd231ps_fma(auVar279,auVar113,auVar192);
              break;
            case 3:
              uVar3 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var7);
              auVar198._4_4_ = uVar3;
              auVar198._0_4_ = uVar3;
              auVar198._8_4_ = uVar3;
              auVar198._12_4_ = uVar3;
              uVar3 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var7))[1];
              auVar225._4_4_ = uVar3;
              auVar225._0_4_ = uVar3;
              auVar225._8_4_ = uVar3;
              auVar225._12_4_ = uVar3;
              auVar113 = vmaxps_avx(auVar172,auVar198);
              auVar279 = vminps_avx(auVar113,auVar225);
              break;
            case 4:
              uVar62 = CONCAT44(auVar172._4_4_,auVar172._0_4_);
              auVar173._0_8_ = uVar62 ^ 0x8000000080000000;
              auVar173._8_4_ = -auVar172._8_4_;
              auVar173._12_4_ = -auVar172._12_4_;
              auVar199._8_4_ = 0x42b0c0a5;
              auVar199._0_8_ = 0x42b0c0a542b0c0a5;
              auVar199._12_4_ = 0x42b0c0a5;
              auVar113 = vminps_avx(auVar173,auVar199);
              auVar200._8_4_ = 0xc2b0c0a5;
              auVar200._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar200._12_4_ = 0xc2b0c0a5;
              auVar312 = vmaxps_avx(auVar113,auVar200);
              auVar201._8_4_ = 0x3fb8aa3b;
              auVar201._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar201._12_4_ = 0x3fb8aa3b;
              auVar113 = vfmadd213ps_fma(auVar201,auVar312,auVar139);
              auVar226._0_4_ = (int)auVar113._0_4_;
              auVar226._4_4_ = (int)auVar113._4_4_;
              auVar226._8_4_ = (int)auVar113._8_4_;
              auVar226._12_4_ = (int)auVar113._12_4_;
              auVar220 = vcvtdq2ps_avx(auVar226);
              auVar113 = vcmpps_avx(auVar113,auVar220,1);
              auVar298._8_4_ = 0x3f800000;
              auVar298._0_8_ = 0x3f8000003f800000;
              auVar298._12_4_ = 0x3f800000;
              auVar113 = vandps_avx(auVar298,auVar113);
              auVar113 = vsubps_avx(auVar220,auVar113);
              auVar89._8_4_ = 0x3f318000;
              auVar89._0_8_ = 0x3f3180003f318000;
              auVar89._12_4_ = 0x3f318000;
              auVar220 = vfmsub231ps_fma(auVar312,auVar113,auVar89);
              auVar227._8_4_ = 0x395e8083;
              auVar227._0_8_ = 0x395e8083395e8083;
              auVar227._12_4_ = 0x395e8083;
              auVar312 = vfmsub231ps_fma(auVar220,auVar113,auVar227);
              auVar228._0_4_ = auVar312._0_4_ * auVar312._0_4_;
              auVar228._4_4_ = auVar312._4_4_ * auVar312._4_4_;
              auVar228._8_4_ = auVar312._8_4_ * auVar312._8_4_;
              auVar228._12_4_ = auVar312._12_4_ * auVar312._12_4_;
              auVar266._8_4_ = 0x39506967;
              auVar266._0_8_ = 0x3950696739506967;
              auVar266._12_4_ = 0x39506967;
              auVar237._8_4_ = 0x3ab743ce;
              auVar237._0_8_ = 0x3ab743ce3ab743ce;
              auVar237._12_4_ = 0x3ab743ce;
              auVar220 = vfmadd213ps_fma(auVar266,auVar312,auVar237);
              auVar90._8_4_ = 0x3c088908;
              auVar90._0_8_ = 0x3c0889083c088908;
              auVar90._12_4_ = 0x3c088908;
              auVar220 = vfmadd213ps_fma(auVar220,auVar312,auVar90);
              auVar91._8_4_ = 0x3d2aa9c1;
              auVar91._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar91._12_4_ = 0x3d2aa9c1;
              auVar220 = vfmadd213ps_fma(auVar220,auVar312,auVar91);
              auVar92._8_4_ = 0x3e2aaaaa;
              auVar92._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar92._12_4_ = 0x3e2aaaaa;
              auVar220 = vfmadd213ps_fma(auVar220,auVar312,auVar92);
              auVar139 = vfmadd213ps_fma(auVar220,auVar312,auVar139);
              auVar139 = vfmadd213ps_fma(auVar139,auVar228,auVar312);
              auVar174._0_4_ = auVar139._0_4_ + 1.0;
              auVar174._4_4_ = auVar139._4_4_ + 1.0;
              auVar174._8_4_ = auVar139._8_4_ + 1.0;
              auVar174._12_4_ = auVar139._12_4_ + 1.0;
              auVar202._0_4_ = (int)auVar113._0_4_;
              auVar202._4_4_ = (int)auVar113._4_4_;
              auVar202._8_4_ = (int)auVar113._8_4_;
              auVar202._12_4_ = (int)auVar113._12_4_;
              auVar113 = vpslld_avx(auVar202,0x17);
              auVar113 = vpaddd_avx(auVar298,auVar113);
              auVar139 = vfmadd213ps_fma(auVar113,auVar174,auVar298);
              auVar113 = vrcpps_avx(auVar139);
              auVar139 = vfmsub213ps_fma(auVar139,auVar113,auVar298);
              auVar279 = vfnmadd132ps_fma(auVar139,auVar113,auVar113);
              break;
            case 5:
              auVar236._8_4_ = 0x42b0c0a5;
              auVar236._0_8_ = 0x42b0c0a542b0c0a5;
              auVar236._12_4_ = 0x42b0c0a5;
              auVar113 = vminps_avx(auVar236,auVar172);
              auVar312 = vmaxps_avx(auVar248,auVar113);
              auVar218._8_4_ = 0x3fb8aa3b;
              auVar218._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar218._12_4_ = 0x3fb8aa3b;
              auVar113 = vfmadd213ps_fma(auVar218,auVar312,auVar139);
              auVar258._0_4_ = (int)auVar113._0_4_;
              auVar258._4_4_ = (int)auVar113._4_4_;
              auVar258._8_4_ = (int)auVar113._8_4_;
              auVar258._12_4_ = (int)auVar113._12_4_;
              auVar220 = vcvtdq2ps_avx(auVar258);
              auVar113 = vcmpps_avx(auVar113,auVar220,1);
              auVar316._8_4_ = 0x3f800000;
              auVar316._0_8_ = 0x3f8000003f800000;
              auVar316._12_4_ = 0x3f800000;
              auVar113 = vandps_avx(auVar316,auVar113);
              auVar113 = vsubps_avx(auVar220,auVar113);
              auVar114._8_4_ = 0x3f318000;
              auVar114._0_8_ = 0x3f3180003f318000;
              auVar114._12_4_ = 0x3f318000;
              auVar220 = vfmsub231ps_fma(auVar312,auVar113,auVar114);
              auVar312 = vfnmsub231ps_fma(auVar220,auVar113,auVar213);
              auVar259._0_4_ = auVar312._0_4_ * auVar312._0_4_;
              auVar259._4_4_ = auVar312._4_4_ * auVar312._4_4_;
              auVar259._8_4_ = auVar312._8_4_ * auVar312._8_4_;
              auVar259._12_4_ = auVar312._12_4_ * auVar312._12_4_;
              auVar141._8_4_ = 0x39506967;
              auVar141._0_8_ = 0x3950696739506967;
              auVar141._12_4_ = 0x39506967;
              auVar220 = vfmadd213ps_fma(auVar141,auVar312,auVar253);
              auVar85._8_4_ = 0x3c088908;
              auVar85._0_8_ = 0x3c0889083c088908;
              auVar85._12_4_ = 0x3c088908;
              auVar220 = vfmadd213ps_fma(auVar220,auVar312,auVar85);
              auVar294._8_4_ = 0x3d2aa9c1;
              auVar294._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar294._12_4_ = 0x3d2aa9c1;
              auVar220 = vfmadd213ps_fma(auVar220,auVar312,auVar294);
              auVar295._8_4_ = 0x3e2aaaaa;
              auVar295._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar295._12_4_ = 0x3e2aaaaa;
              auVar220 = vfmadd213ps_fma(auVar220,auVar312,auVar295);
              auVar220 = vfmadd213ps_fma(auVar220,auVar312,auVar139);
              auVar220 = vfmadd213ps_fma(auVar220,auVar259,auVar312);
              auVar193._0_4_ = auVar220._0_4_ + 1.0;
              auVar193._4_4_ = auVar220._4_4_ + 1.0;
              auVar193._8_4_ = auVar220._8_4_ + 1.0;
              auVar193._12_4_ = auVar220._12_4_ + 1.0;
              auVar219._0_4_ = (int)auVar113._0_4_;
              auVar219._4_4_ = (int)auVar113._4_4_;
              auVar219._8_4_ = (int)auVar113._8_4_;
              auVar219._12_4_ = (int)auVar113._12_4_;
              auVar113 = vpslld_avx(auVar219,0x17);
              auVar113 = vpaddd_avx(auVar316,auVar113);
              auVar140 = vfmadd213ps_fma(auVar113,auVar193,auVar316);
              auVar194._8_4_ = 0x800000;
              auVar194._0_8_ = 0x80000000800000;
              auVar194._12_4_ = 0x800000;
              auVar113 = vmaxps_avx(auVar140,auVar194);
              auVar220 = vpsrld_avx(auVar113,0x17);
              auVar260._8_4_ = 0xffffff82;
              auVar260._0_8_ = 0xffffff82ffffff82;
              auVar260._12_4_ = 0xffffff82;
              auVar220 = vpaddd_avx(auVar260,auVar220);
              auVar261._8_4_ = 0x807fffff;
              auVar261._0_8_ = 0x807fffff807fffff;
              auVar261._12_4_ = 0x807fffff;
              auVar113 = vandps_avx(auVar261,auVar113);
              auVar84 = vorps_avx(auVar113,auVar139);
              auVar312 = vcvtdq2ps_avx(auVar220);
              auVar262._8_4_ = 0x3f3504f3;
              auVar262._0_8_ = 0x3f3504f33f3504f3;
              auVar262._12_4_ = 0x3f3504f3;
              auVar220 = vcmpps_avx(auVar84,auVar262,1);
              auVar113 = vandps_avx(auVar220,auVar84);
              auVar195._0_4_ = auVar113._0_4_ + auVar84._0_4_ + -1.0;
              auVar195._4_4_ = auVar113._4_4_ + auVar84._4_4_ + -1.0;
              auVar195._8_4_ = auVar113._8_4_ + auVar84._8_4_ + -1.0;
              auVar195._12_4_ = auVar113._12_4_ + auVar84._12_4_ + -1.0;
              auVar113 = vandps_avx(auVar220,auVar316);
              auVar220 = vsubps_avx(auVar312,auVar113);
              auVar263._0_4_ = auVar195._0_4_ * auVar195._0_4_;
              auVar263._4_4_ = auVar195._4_4_ * auVar195._4_4_;
              auVar263._8_4_ = auVar195._8_4_ * auVar195._8_4_;
              auVar263._12_4_ = auVar195._12_4_ * auVar195._12_4_;
              auVar296._8_4_ = 0x3d9021bb;
              auVar296._0_8_ = 0x3d9021bb3d9021bb;
              auVar296._12_4_ = 0x3d9021bb;
              auVar303._8_4_ = 0xbdebd1b8;
              auVar303._0_8_ = 0xbdebd1b8bdebd1b8;
              auVar303._12_4_ = 0xbdebd1b8;
              auVar113 = vfmadd213ps_fma(auVar296,auVar195,auVar303);
              auVar304._8_4_ = 0x3def251a;
              auVar304._0_8_ = 0x3def251a3def251a;
              auVar304._12_4_ = 0x3def251a;
              auVar113 = vfmadd213ps_fma(auVar113,auVar195,auVar304);
              auVar305._8_4_ = 0xbdfe5d4f;
              auVar305._0_8_ = 0xbdfe5d4fbdfe5d4f;
              auVar305._12_4_ = 0xbdfe5d4f;
              auVar113 = vfmadd213ps_fma(auVar113,auVar195,auVar305);
              auVar306._8_4_ = 0x3e11e9bf;
              auVar306._0_8_ = 0x3e11e9bf3e11e9bf;
              auVar306._12_4_ = 0x3e11e9bf;
              auVar113 = vfmadd213ps_fma(auVar113,auVar195,auVar306);
              auVar307._8_4_ = 0xbe2aae50;
              auVar307._0_8_ = 0xbe2aae50be2aae50;
              auVar307._12_4_ = 0xbe2aae50;
              auVar113 = vfmadd213ps_fma(auVar113,auVar195,auVar307);
              auVar308._8_4_ = 0x3e4cceac;
              auVar308._0_8_ = 0x3e4cceac3e4cceac;
              auVar308._12_4_ = 0x3e4cceac;
              auVar113 = vfmadd213ps_fma(auVar113,auVar195,auVar308);
              auVar309._8_4_ = 0xbe7ffffc;
              auVar309._0_8_ = 0xbe7ffffcbe7ffffc;
              auVar309._12_4_ = 0xbe7ffffc;
              auVar113 = vfmadd213ps_fma(auVar113,auVar195,auVar309);
              auVar310._8_4_ = 0x3eaaaaaa;
              auVar310._0_8_ = 0x3eaaaaaa3eaaaaaa;
              auVar310._12_4_ = 0x3eaaaaaa;
              auVar113 = vfmadd213ps_fma(auVar113,auVar195,auVar310);
              auVar297._0_4_ = auVar263._0_4_ * auVar195._0_4_ * auVar113._0_4_;
              auVar297._4_4_ = auVar263._4_4_ * auVar195._4_4_ * auVar113._4_4_;
              auVar297._8_4_ = auVar263._8_4_ * auVar195._8_4_ * auVar113._8_4_;
              auVar297._12_4_ = auVar263._12_4_ * auVar195._12_4_ * auVar113._12_4_;
              auVar113 = vfmadd231ps_fma(auVar297,auVar220,auVar213);
              auVar312 = vfmsub231ps_fma(auVar113,auVar139,auVar263);
              auVar113 = vcmpps_avx(auVar140,_DAT_004e9a90,2);
              auVar312 = vsubps_avx(auVar312,auVar195);
              auVar220 = vfnmadd231ps_fma(auVar312,auVar114,auVar220);
              auVar196._0_4_ = auVar220._0_4_ + auVar220._0_4_;
              auVar196._4_4_ = auVar220._4_4_ + auVar220._4_4_;
              auVar196._8_4_ = auVar220._8_4_ + auVar220._8_4_;
              auVar196._12_4_ = auVar220._12_4_ + auVar220._12_4_;
              auVar221._8_4_ = 0x7fffffff;
              auVar221._0_8_ = 0x7fffffff7fffffff;
              auVar221._12_4_ = 0x7fffffff;
              auVar113 = vblendvps_avx(auVar196,auVar221,auVar113);
              auVar113 = vminps_avx(auVar236,auVar113);
              auVar312 = vmaxps_avx(auVar248,auVar113);
              auVar222._8_4_ = 0x3fb8aa3b;
              auVar222._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar222._12_4_ = 0x3fb8aa3b;
              auVar113 = vfmadd213ps_fma(auVar222,auVar312,auVar139);
              auVar264._0_4_ = (int)auVar113._0_4_;
              auVar264._4_4_ = (int)auVar113._4_4_;
              auVar264._8_4_ = (int)auVar113._8_4_;
              auVar264._12_4_ = (int)auVar113._12_4_;
              auVar220 = vcvtdq2ps_avx(auVar264);
              auVar113 = vcmpps_avx(auVar113,auVar220,1);
              auVar113 = vandps_avx(auVar316,auVar113);
              auVar113 = vsubps_avx(auVar220,auVar113);
              auVar220 = vfmsub231ps_fma(auVar312,auVar113,auVar114);
              auVar177 = ZEXT1664(auVar139);
              auVar82 = ZEXT864(0);
              auVar312 = vfnmsub231ps_fma(auVar220,auVar113,auVar213);
              auVar265._0_4_ = auVar312._0_4_ * auVar312._0_4_;
              auVar265._4_4_ = auVar312._4_4_ * auVar312._4_4_;
              auVar265._8_4_ = auVar312._8_4_ * auVar312._8_4_;
              auVar265._12_4_ = auVar312._12_4_ * auVar312._12_4_;
              auVar220 = vfmadd213ps_fma(auVar141,auVar312,auVar253);
              auVar220 = vfmadd213ps_fma(auVar220,auVar312,auVar85);
              auVar86._8_4_ = 0x3d2aa9c1;
              auVar86._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar86._12_4_ = 0x3d2aa9c1;
              auVar220 = vfmadd213ps_fma(auVar220,auVar312,auVar86);
              auVar87._8_4_ = 0x3e2aaaaa;
              auVar87._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar87._12_4_ = 0x3e2aaaaa;
              auVar220 = vfmadd213ps_fma(auVar220,auVar312,auVar87);
              auVar139 = vfmadd213ps_fma(auVar220,auVar312,auVar139);
              auVar139 = vfmadd213ps_fma(auVar139,auVar265,auVar312);
              auVar197._0_4_ = auVar139._0_4_ + 1.0;
              auVar197._4_4_ = auVar139._4_4_ + 1.0;
              auVar197._8_4_ = auVar139._8_4_ + 1.0;
              auVar197._12_4_ = auVar139._12_4_ + 1.0;
              auVar223._0_4_ = (int)auVar113._0_4_;
              auVar223._4_4_ = (int)auVar113._4_4_;
              auVar223._8_4_ = (int)auVar113._8_4_;
              auVar223._12_4_ = (int)auVar113._12_4_;
              auVar113 = vpslld_avx(auVar223,0x17);
              auVar113 = vpaddd_avx(auVar316,auVar113);
              auVar139 = vfmadd213ps_fma(auVar113,auVar197,auVar316);
              auVar113 = vrcpps_avx(auVar139);
              auVar224._0_4_ = auVar113._0_4_ + auVar113._0_4_;
              auVar224._4_4_ = auVar113._4_4_ + auVar113._4_4_;
              auVar224._8_4_ = auVar113._8_4_ + auVar113._8_4_;
              auVar224._12_4_ = auVar113._12_4_ + auVar113._12_4_;
              auVar88._8_4_ = 0x40000000;
              auVar88._0_8_ = 0x4000000040000000;
              auVar88._12_4_ = 0x40000000;
              auVar139 = vfmsub213ps_fma(auVar139,auVar224,auVar88);
              auVar113 = vfnmadd213ps_fma(auVar139,auVar113,auVar224);
              auVar279 = vfmsub213ps_fma(auVar113,auVar172,auVar172);
              break;
            case 6:
              uVar3 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var7);
              auVar203._4_4_ = uVar3;
              auVar203._0_4_ = uVar3;
              auVar203._8_4_ = uVar3;
              auVar203._12_4_ = uVar3;
              uVar3 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var7))[1];
              auVar229._4_4_ = uVar3;
              auVar229._0_4_ = uVar3;
              auVar229._8_4_ = uVar3;
              auVar229._12_4_ = uVar3;
              auVar139 = vfmadd231ps_fma(auVar229,auVar172,auVar203);
              auVar113 = vmaxps_avx(auVar139,auVar113);
              auVar230._8_4_ = 0x3f800000;
              auVar230._0_8_ = 0x3f8000003f800000;
              auVar230._12_4_ = 0x3f800000;
              auVar113 = vminps_avx(auVar113,auVar230);
              auVar279._0_4_ = auVar113._0_4_ * auVar172._0_4_;
              auVar279._4_4_ = auVar113._4_4_ * auVar172._4_4_;
              auVar279._8_4_ = auVar113._8_4_ * auVar172._8_4_;
              auVar279._12_4_ = auVar113._12_4_ * auVar172._12_4_;
            }
          }
          if (iVar19 == 1) {
            *(int *)*local_1c0 = auVar279._0_4_;
            uVar3 = vextractps_avx(auVar279,1);
            *(undefined4 *)((long)*local_1c0 + lVar63 * 4) = uVar3;
            uVar3 = vextractps_avx(auVar279,2);
            *(undefined4 *)((long)*local_1c0 + (long)(iVar36 * 2) * 4) = uVar3;
            uVar3 = vextractps_avx(auVar279,3);
            *(undefined4 *)((long)*local_1c0 + (long)(iVar36 * 3) * 4) = uVar3;
            local_1c0 = (undefined1 (*) [16])((long)*local_1c0 + 4);
          }
          else if (iVar19 == 4) {
            *local_1c0 = auVar279;
            local_1c0 = local_1c0 + 1;
          }
          iVar51 = iVar51 + local_88.elempack * iVar5;
          lVar71 = lVar71 + lVar2;
          lVar27 = lVar27 + lVar2;
        }
      }
      iVar34 = iVar34 * 8 + iVar50 * 4;
      uVar26 = (long)(iVar52 - iVar34) / 2;
      lVar38 = (long)local_88.h * (long)local_88.elempack;
      uVar43 = top_blob->w;
      lVar63 = (long)(int)uVar43 * top_blob->elemsize;
      pvVar8 = top_blob->data;
      iVar36 = local_88.elempack * iVar5;
      uVar58 = 0;
      uVar64 = 0;
      if (0 < (int)uVar43) {
        uVar64 = (ulong)uVar43;
      }
      iVar52 = (int)uVar26;
      uVar70 = 0;
      if (0 < iVar52) {
        uVar70 = uVar26 & 0xffffffff;
      }
      for (; uVar58 != uVar70; uVar58 = uVar58 + 1) {
        uVar26 = (long)iVar34 + uVar58 * 2;
        uVar43 = (int)uVar26 >> 0x1f;
        uVar60 = (ulong)uVar43 << 0x20 | uVar26 & 0xffffffff;
        puVar28 = (undefined4 *)(uVar26 * lVar63 + (long)pvVar8);
        sVar9 = (this->weight_data_tm).cstep;
        sVar10 = (this->weight_data_tm).elemsize;
        puVar69 = (undefined4 *)(((long)iVar34 + uVar58 * 2 + 1) * lVar63 + (long)pvVar8);
        pvVar11 = (this->weight_data_tm).data;
        pfVar12 = *(float **)(&this->field_0xf8 + (long)p_Var7);
        lVar27 = 0;
        iVar50 = 0;
        lVar39 = lVar47 * 4;
        for (uVar45 = 0; uVar45 != uVar64; uVar45 = uVar45 + 1) {
          if (lVar61 == 0) {
            fVar83 = 0.0;
            fVar111 = 0.0;
          }
          else {
            pfVar65 = (float *)(lVar61 + uVar26 * 4);
            fVar83 = *pfVar65;
            fVar111 = pfVar65[1];
          }
          iVar19 = iVar36 * (int)uVar45;
          lVar67 = (long)local_88.w *
                   CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
          lVar71 = (long)local_88.data + lVar39;
          puVar55 = (undefined4 *)((long)local_88.data + lVar27);
          auVar82 = ZEXT1664(ZEXT816(0) << 0x40);
          uVar62 = 0;
          auVar177 = ZEXT1664(ZEXT816(0) << 0x40);
          pauVar53 = (undefined1 (*) [32])
                     ((long)(((int)((long)((ulong)uVar43 << 0x20 | uVar26 & 0xffffffff) % 4) >> 1) +
                             (int)((long)uVar60 / 8) +
                            (int)(char)((char)((long)uVar60 % 8) / '\x04')) * sVar9 * sVar10 +
                     (long)pvVar11);
          while( true ) {
            local_220 = (int)lVar38;
            if (local_220 <= (int)((uint)uVar62 | 7)) break;
            lVar40 = (int)((long)((ulong)(uint)((int)(uint)uVar62 >> 0x1f) << 0x20 |
                                 uVar62 & 0xffffffff) / (long)iVar4) * lVar67;
            if (iVar4 == 8) {
              pauVar31 = (undefined1 (*) [32])((long)local_88.data + lVar40 + (long)iVar50 * 4);
              uVar30 = uVar75;
              pauVar46 = pauVar53;
              while (iVar51 = (int)uVar30, uVar30 = (ulong)(iVar51 - 1), iVar51 != 0) {
                auVar113 = vfmadd231ps_fma(auVar82._0_32_,*pauVar31,*pauVar46);
                auVar82 = ZEXT1664(auVar113);
                auVar113 = vfmadd231ps_fma(auVar177._0_32_,*pauVar31,pauVar46[1]);
                auVar177 = ZEXT1664(auVar113);
                pauVar46 = pauVar46 + 2;
                pauVar31 = (undefined1 (*) [32])(*pauVar31 + lVar44 * 4);
              }
              pauVar53 = pauVar53 + uVar75 * 2;
            }
            else {
              pauVar31 = (undefined1 (*) [32])((long)local_88.data + lVar40 + (long)iVar19 * 4);
            }
            uVar30 = uVar75;
            pauVar46 = pauVar53;
            pauVar68 = pauVar31;
            if (iVar4 == 4) {
              while ((int)uVar30 != 0) {
                auVar167._16_16_ = *(undefined1 (*) [16])(*pauVar68 + lVar47 * 4);
                auVar167._0_16_ = *(undefined1 (*) [16])*pauVar68;
                auVar113 = vfmadd231ps_fma(auVar82._0_32_,auVar167,*pauVar46);
                auVar82 = ZEXT1664(auVar113);
                auVar113 = vfmadd231ps_fma(auVar177._0_32_,auVar167,pauVar46[1]);
                auVar177 = ZEXT1664(auVar113);
                uVar30 = (ulong)((int)uVar30 - 1);
                pauVar46 = pauVar46 + 2;
                pauVar68 = (undefined1 (*) [32])(*pauVar68 + lVar1);
              }
              pauVar53 = pauVar53 + uVar75 * 2;
              pauVar31 = (undefined1 (*) [32])(*pauVar31 + lVar59);
            }
            if (iVar4 == 1) {
              pauVar46 = pauVar53 + 1;
              uVar30 = uVar75;
              while (iVar51 = (int)uVar30, uVar30 = (ulong)(iVar51 - 1), iVar51 != 0) {
                auVar113 = vinsertps_avx(ZEXT416(*(uint *)*pauVar31),
                                         ZEXT416(*(uint *)(*pauVar31 + lVar47 * 4)),0x10);
                auVar113 = vinsertps_avx(auVar113,ZEXT416(*(uint *)(*pauVar31 + lVar72 * 4)),0x20);
                auVar113 = vinsertps_avx(auVar113,ZEXT416(*(uint *)(*pauVar31 + lVar73 * 4)),0x30);
                auVar139 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar31 + lVar22 * 4)),
                                         ZEXT416(*(uint *)(*pauVar31 + lVar23 * 4)),0x10);
                auVar139 = vinsertps_avx(auVar139,ZEXT416(*(uint *)(*pauVar31 + lVar24 * 4)),0x20);
                auVar139 = vinsertps_avx(auVar139,ZEXT416(*(uint *)(*pauVar31 + lVar25 * 4)),0x30);
                auVar168._16_16_ = auVar139;
                auVar168._0_16_ = auVar113;
                auVar113 = vfmadd231ps_fma(auVar82._0_32_,auVar168,pauVar46[-1]);
                auVar82 = ZEXT1664(auVar113);
                auVar113 = vfmadd231ps_fma(auVar177._0_32_,auVar168,*pauVar46);
                auVar177 = ZEXT1664(auVar113);
                pauVar46 = pauVar46 + 2;
                pauVar31 = (undefined1 (*) [32])(*pauVar31 + lVar49);
              }
              pauVar53 = pauVar53 + uVar75 * 2;
            }
            uVar62 = uVar62 + 8;
            lVar71 = lVar71 + lVar67 * 8;
            puVar55 = puVar55 + lVar67 * 2;
          }
          auVar93._0_4_ = auVar82._16_4_ + auVar82._0_4_;
          auVar93._4_4_ = auVar82._20_4_ + auVar82._4_4_;
          auVar93._8_4_ = auVar82._24_4_ + auVar82._8_4_;
          auVar93._12_4_ = auVar82._28_4_ + auVar82._12_4_;
          auVar113 = vshufpd_avx(auVar93,auVar93,1);
          auVar94._0_4_ = auVar113._0_4_ + auVar93._0_4_;
          auVar94._4_4_ = auVar113._4_4_ + auVar93._4_4_;
          auVar94._8_4_ = auVar113._8_4_ + auVar93._8_4_;
          auVar94._12_4_ = auVar113._12_4_ + auVar93._12_4_;
          auVar115._0_4_ = auVar177._16_4_ + auVar177._0_4_;
          auVar115._4_4_ = auVar177._20_4_ + auVar177._4_4_;
          auVar115._8_4_ = auVar177._24_4_ + auVar177._8_4_;
          auVar115._12_4_ = auVar177._28_4_ + auVar177._12_4_;
          auVar113 = vshufpd_avx(auVar115,auVar115,1);
          auVar116._0_4_ = auVar113._0_4_ + auVar115._0_4_;
          auVar116._4_4_ = auVar113._4_4_ + auVar115._4_4_;
          auVar116._8_4_ = auVar113._8_4_ + auVar115._8_4_;
          auVar116._12_4_ = auVar113._12_4_ + auVar115._12_4_;
          auVar82 = ZEXT864(0) << 0x40;
          auVar177 = ZEXT1664(ZEXT816(0) << 0x40);
          for (; (int)((uint)uVar62 | 3) < local_220; uVar62 = uVar62 + 4) {
            lVar40 = (int)((long)((ulong)(uint)((int)(uint)uVar62 >> 0x1f) << 0x20 |
                                 uVar62 & 0xffffffff) / (long)iVar4) * lVar67;
            if (iVar4 == 4) {
              pauVar54 = (undefined1 (*) [16])((long)local_88.data + lVar40 + (long)iVar50 * 4);
              uVar30 = uVar75;
              pauVar31 = pauVar53;
              while (iVar51 = (int)uVar30, uVar30 = (ulong)(iVar51 - 1), iVar51 != 0) {
                auVar113 = vfmadd231ps_fma(auVar82._0_16_,*pauVar54,*(undefined1 (*) [16])*pauVar31)
                ;
                auVar82 = ZEXT1664(auVar113);
                auVar113 = vfmadd231ps_fma(auVar177._0_16_,*pauVar54,
                                           *(undefined1 (*) [16])(*pauVar31 + 0x10));
                auVar177 = ZEXT1664(auVar113);
                pauVar31 = pauVar31 + 1;
                pauVar54 = (undefined1 (*) [16])(*pauVar54 + lVar1);
              }
              pauVar53 = pauVar53 + uVar75;
            }
            else {
              pauVar54 = (undefined1 (*) [16])((long)local_88.data + lVar40 + (long)iVar19 * 4);
            }
            uVar30 = uVar75;
            pauVar31 = pauVar53;
            if (iVar4 == 1) {
              while ((int)uVar30 != 0) {
                auVar113 = vinsertps_avx(ZEXT416(*(uint *)*pauVar54),
                                         ZEXT416(*(uint *)(*pauVar54 + lVar47 * 4)),0x10);
                auVar113 = vinsertps_avx(auVar113,ZEXT416(*(uint *)(*pauVar54 + lVar72 * 4)),0x20);
                auVar113 = vinsertps_avx(auVar113,ZEXT416(*(uint *)(*pauVar54 + lVar73 * 4)),0x30);
                auVar139 = vfmadd231ps_fma(auVar82._0_16_,auVar113,*(undefined1 (*) [16])*pauVar31);
                auVar82 = ZEXT1664(auVar139);
                auVar113 = vfmadd231ps_fma(auVar177._0_16_,auVar113,
                                           *(undefined1 (*) [16])(*pauVar31 + 0x10));
                auVar177 = ZEXT1664(auVar113);
                pauVar54 = (undefined1 (*) [16])(*pauVar54 + lVar49);
                uVar30 = (ulong)((int)uVar30 - 1);
                pauVar31 = pauVar31 + 1;
              }
              pauVar53 = pauVar53 + uVar75;
            }
            lVar71 = lVar71 + lVar67 * 4;
            puVar55 = puVar55 + lVar67;
          }
          auVar113 = vshufpd_avx(auVar82._0_16_,auVar82._0_16_,1);
          auVar142._0_4_ = auVar113._0_4_ + auVar82._0_4_;
          auVar142._4_4_ = auVar113._4_4_ + auVar82._4_4_;
          auVar142._8_4_ = auVar113._8_4_ + auVar82._8_4_;
          auVar142._12_4_ = auVar113._12_4_ + auVar82._12_4_;
          auVar113 = vshufpd_avx(auVar177._0_16_,auVar177._0_16_,1);
          auVar175._0_4_ = auVar113._0_4_ + auVar177._0_4_;
          auVar175._4_4_ = auVar113._4_4_ + auVar177._4_4_;
          auVar175._8_4_ = auVar113._8_4_ + auVar177._8_4_;
          auVar175._12_4_ = auVar113._12_4_ + auVar177._12_4_;
          auVar113 = vinsertps_avx(auVar116,auVar94,0x4c);
          auVar139 = vinsertps_avx(auVar94,auVar116,0x1c);
          auVar213 = vinsertps_avx(auVar175,auVar142,0x4c);
          auVar220 = vinsertps_avx(auVar142,auVar175,0x1c);
          auVar82 = ZEXT1664(CONCAT412(auVar113._12_4_ + 0.0 + auVar139._12_4_ +
                                       auVar213._12_4_ + auVar220._12_4_,
                                       CONCAT48(auVar113._8_4_ + 0.0 + auVar139._8_4_ +
                                                auVar213._8_4_ + auVar220._8_4_,
                                                CONCAT44(auVar113._4_4_ + fVar111 + auVar139._4_4_ +
                                                         auVar213._4_4_ + auVar220._4_4_,
                                                         auVar113._0_4_ + fVar83 + auVar139._0_4_ +
                                                         auVar213._0_4_ + auVar220._0_4_))));
          for (; (long)(uVar62 | 1) < lVar38; uVar62 = uVar62 + 2) {
            lVar40 = 0;
            uVar30 = uVar75;
            pauVar31 = pauVar53;
            while (iVar19 = (int)uVar30, uVar30 = (ulong)(iVar19 - 1), iVar19 != 0) {
              uVar3 = *(undefined4 *)((long)puVar55 + lVar40);
              auVar77._4_4_ = uVar3;
              auVar77._0_4_ = uVar3;
              auVar77._8_4_ = uVar3;
              auVar77._12_4_ = uVar3;
              auVar95._8_8_ = 0;
              auVar95._0_8_ = *(ulong *)*pauVar31;
              auVar117._8_8_ = 0;
              auVar117._0_8_ = *(ulong *)(*pauVar31 + 8);
              auVar113 = vfmadd213ps_fma(auVar95,auVar77,auVar82._0_16_);
              uVar3 = *(undefined4 *)(lVar71 + lVar40);
              auVar204._4_4_ = uVar3;
              auVar204._0_4_ = uVar3;
              auVar204._8_4_ = uVar3;
              auVar204._12_4_ = uVar3;
              auVar113 = vfmadd213ps_fma(auVar204,auVar117,auVar113);
              auVar82 = ZEXT1664(auVar113);
              pauVar31 = (undefined1 (*) [32])(*pauVar31 + 0x10);
              lVar40 = lVar40 + lVar49;
            }
            pauVar53 = (undefined1 (*) [32])(*pauVar53 + lVar66);
            lVar71 = lVar71 + lVar67 * 2;
            puVar55 = (undefined4 *)((long)puVar55 + lVar67 * 2);
          }
          for (; auVar206 = auVar82._0_16_, (long)uVar62 < lVar38; uVar62 = uVar62 + 1) {
            puVar32 = puVar55;
            for (lVar71 = 0; iVar74 != (int)lVar71; lVar71 = lVar71 + 1) {
              auVar78._8_8_ = 0;
              auVar78._0_8_ = *(ulong *)(*pauVar53 + lVar71 * 8);
              uVar3 = *puVar32;
              auVar96._4_4_ = uVar3;
              auVar96._0_4_ = uVar3;
              auVar96._8_4_ = uVar3;
              auVar96._12_4_ = uVar3;
              auVar113 = vfmadd231ps_fma(auVar82._0_16_,auVar78,auVar96);
              auVar82 = ZEXT1664(auVar113);
              puVar32 = puVar32 + lVar48;
            }
            pauVar53 = (undefined1 (*) [32])(*pauVar53 + uVar75 * 8);
            puVar55 = (undefined4 *)((long)puVar55 + lVar67);
          }
          if (5 < iVar6 - 1U) goto LAB_0049b87b;
          auVar113 = vmovshdup_avx(auVar206);
          fVar83 = auVar82._0_4_;
          fVar111 = auVar113._0_4_;
          switch(iVar6) {
          case 1:
            auVar206 = vmaxps_avx(auVar206,_DAT_004e9a90);
            break;
          case 2:
            auVar113 = vcmpps_avx(ZEXT816(0) << 0x40,auVar206,1);
            fVar111 = *pfVar12;
            auVar99._4_4_ = fVar111;
            auVar99._0_4_ = fVar111;
            auVar99._8_4_ = fVar111;
            auVar99._12_4_ = fVar111;
            auVar118._8_4_ = 0x3f800000;
            auVar118._0_8_ = 0x3f8000003f800000;
            auVar118._12_4_ = 0x3f800000;
            auVar113 = vblendvps_avx(auVar99,auVar118,auVar113);
            goto LAB_0049b868;
          case 3:
            auVar79._8_8_ = 0;
            auVar79._0_8_ = *(ulong *)pfVar12;
            auVar220 = vmaxss_avx(auVar79,auVar206);
            auVar139 = vinsertps_avx(auVar79,auVar220,0x10);
            auVar213 = vinsertps_avx(auVar113,auVar79,0x50);
            auVar139 = vcmpps_avx(auVar213,auVar139,1);
            auVar113 = vinsertps_avx(auVar113,auVar220,0x10);
            auVar113 = vblendvps_avx(auVar113,auVar79,auVar139);
            auVar206 = vshufps_avx(auVar113,auVar113,0xe1);
            auVar113 = vcmpps_avx(auVar79,auVar206,1);
            if ((auVar113 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar206 = vinsertps_avx(auVar206,auVar79,0x50);
            }
            break;
          case 4:
            auVar143._8_4_ = 0x42b0c0a5;
            auVar143._0_8_ = 0x42b0c0a542b0c0a5;
            auVar143._12_4_ = 0x42b0c0a5;
            auVar139 = vminps_avx(auVar206,auVar143);
            auVar97._8_4_ = 0xc2b0c0a5;
            auVar97._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar97._12_4_ = 0xc2b0c0a5;
            auVar113 = vcmpps_avx(auVar139,auVar97,1);
            auVar80._0_8_ = auVar139._0_8_ ^ 0x8000000080000000;
            auVar80._8_4_ = auVar139._8_4_ ^ 0x80000000;
            auVar80._12_4_ = auVar139._12_4_ ^ 0x80000000;
            auVar113 = vblendvps_avx(auVar80,auVar143,auVar113);
            local_1d8._0_4_ = expf(auVar113._0_4_);
            local_1d8._4_4_ = extraout_XMM0_Db_00;
            local_1d8._8_4_ = extraout_XMM0_Dc_00;
            local_1d8._12_4_ = extraout_XMM0_Dd_00;
            auVar113 = vmovshdup_avx(auVar113);
            auVar82._0_4_ = expf(auVar113._0_4_);
            auVar82._4_60_ = extraout_var_00;
            auVar113 = vinsertps_avx(local_1d8,auVar82._0_16_,0x10);
            auVar98._8_4_ = 0x3f800000;
            auVar98._0_8_ = 0x3f8000003f800000;
            auVar98._12_4_ = 0x3f800000;
            auVar205._0_4_ = auVar113._0_4_ + 1.0;
            auVar205._4_4_ = auVar113._4_4_ + 1.0;
            auVar205._8_4_ = auVar113._8_4_ + 1.0;
            auVar205._12_4_ = auVar113._12_4_ + 1.0;
            auVar113 = vrcpps_avx(auVar205);
            auVar139 = vfmsub213ps_fma(auVar205,auVar113,auVar98);
            auVar206 = vfnmadd132ps_fma(auVar139,auVar113,auVar113);
            break;
          case 5:
            fVar76 = expf(fVar83);
            fVar76 = logf(fVar76 + 1.0);
            local_1b8._0_4_ = tanhf(fVar76);
            local_1b8._4_4_ = extraout_XMM0_Db;
            local_1b8._8_4_ = extraout_XMM0_Dc;
            local_1b8._12_4_ = extraout_XMM0_Dd;
            fVar111 = expf(fVar111);
            fVar111 = logf(fVar111 + 1.0);
            auVar177._0_4_ = tanhf(fVar111);
            auVar177._4_60_ = extraout_var;
            auVar113 = vinsertps_avx(local_1b8,auVar177._0_16_,0x10);
LAB_0049b868:
            auVar206._0_4_ = auVar113._0_4_ * fVar83;
            auVar206._4_4_ = auVar113._4_4_ * auVar82._4_4_;
            auVar206._8_4_ = auVar113._8_4_ * auVar82._8_4_;
            auVar206._12_4_ = auVar113._12_4_ * auVar82._12_4_;
            break;
          case 6:
            fVar76 = *pfVar12;
            fVar138 = pfVar12[1];
            fVar112 = -fVar138 / fVar76;
            auVar139 = SUB6416(ZEXT464(0),0) << 0x20;
            if ((fVar112 <= fVar83) && (auVar139 = auVar206, fVar83 <= fVar112 + 1.0 / fVar76)) {
              auVar139 = vfmadd213ss_fma(auVar206,ZEXT416((uint)fVar76),ZEXT416((uint)fVar138));
              auVar139 = ZEXT416((uint)(auVar139._0_4_ * fVar83));
            }
            if (fVar112 <= fVar111) {
              auVar206._4_12_ = auVar82._4_12_;
              auVar206._0_4_ = (float)auVar139._0_4_;
              if (fVar111 <= fVar112 + 1.0 / fVar76) {
                auVar113 = vfmadd213ss_fma(ZEXT416((uint)fVar76),auVar113,ZEXT416((uint)fVar138));
                auVar206 = vinsertps_avx(auVar206,ZEXT416((uint)(auVar113._0_4_ * fVar111)),0x10);
              }
            }
            else {
              auVar206 = vblendps_avx(auVar139,_DAT_004e9a90,0xe);
            }
          }
LAB_0049b87b:
          *puVar28 = auVar206._0_4_;
          uVar3 = vextractps_avx(auVar206,1);
          *puVar69 = uVar3;
          puVar28 = puVar28 + 1;
          puVar69 = puVar69 + 1;
          iVar50 = iVar50 + iVar36;
          lVar39 = lVar39 + lVar2;
          lVar27 = lVar27 + lVar2;
        }
      }
      lVar37 = lVar37 * lVar57;
      pvVar8 = top_blob->data;
      iVar36 = top_blob->w;
      sVar9 = top_blob->elemsize;
      local_198 = 0;
      uVar26 = 0;
      if (0 < (int)local_38) {
        uVar26 = local_38 & 0xffffffff;
      }
      for (uVar64 = (ulong)(iVar34 + iVar52 * 2); (long)uVar64 < (long)uVar21; uVar64 = uVar64 + 1)
      {
        uVar43 = (int)uVar64 >> 0x1f;
        uVar58 = (ulong)uVar43 << 0x20 | uVar64 & 0xffffffff;
        sVar10 = (this->weight_data_tm).cstep;
        sVar13 = (this->weight_data_tm).elemsize;
        pfVar65 = (float *)((long)iVar36 * sVar9 * uVar64 + (long)pvVar8);
        pvVar11 = (this->weight_data_tm).data;
        pfVar12 = *(float **)(&this->field_0xf8 + (long)p_Var7);
        lVar57 = 0;
        iVar52 = 0;
        lVar38 = lVar47 * 4;
        for (uVar70 = 0; uVar70 != uVar26; uVar70 = uVar70 + 1) {
          if (lVar61 == 0) {
            fVar83 = 0.0;
          }
          else {
            fVar83 = *(float *)(lVar61 + uVar64 * 4);
          }
          iVar34 = iVar5 * iVar4 * (int)uVar70;
          lVar39 = (long)local_88.w *
                   CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
          lVar63 = (long)local_88.data + lVar38;
          puVar56 = (uint *)((long)local_88.data + lVar57);
          auVar82 = ZEXT1664(ZEXT816(0) << 0x40);
          uVar60 = 0;
          pauVar53 = (undefined1 (*) [32])
                     ((long)((int)((long)((ulong)uVar43 << 0x20 | uVar64 & 0xffffffff) % 2) +
                             (int)((long)uVar58 / 8) +
                             (int)(char)((char)((long)uVar58 % 8) / '\x04') +
                            (int)(char)((char)((long)((ulong)uVar43 << 0x20 | uVar64 & 0xffffffff) %
                                              4) / '\x02')) * sVar10 * sVar13 + (long)pvVar11);
          while( true ) {
            local_138 = (int)lVar37;
            if (local_138 <= (int)((uint)uVar60 | 7)) break;
            lVar27 = (int)((long)((ulong)(uint)((int)(uint)uVar60 >> 0x1f) << 0x20 |
                                 uVar60 & 0xffffffff) / (long)iVar4) * lVar39;
            if (iVar4 == 8) {
              pauVar31 = (undefined1 (*) [32])((long)local_88.data + lVar27 + (long)iVar52 * 4);
              uVar45 = uVar75;
              pauVar46 = pauVar53;
              while (iVar50 = (int)uVar45, uVar45 = (ulong)(iVar50 - 1), iVar50 != 0) {
                auVar113 = vfmadd231ps_fma(auVar82._0_32_,*pauVar31,*pauVar46);
                auVar82 = ZEXT1664(auVar113);
                pauVar46 = pauVar46 + 1;
                pauVar31 = (undefined1 (*) [32])(*pauVar31 + lVar44 * 4);
              }
              pauVar53 = pauVar53 + uVar75;
            }
            else {
              pauVar31 = (undefined1 (*) [32])((long)local_88.data + lVar27 + (long)iVar34 * 4);
            }
            uVar45 = uVar75;
            pauVar46 = pauVar31;
            pauVar68 = pauVar53;
            if (iVar4 == 4) {
              while ((int)uVar45 != 0) {
                auVar135._16_16_ = *(undefined1 (*) [16])(*pauVar46 + lVar47 * 4);
                auVar135._0_16_ = *(undefined1 (*) [16])*pauVar46;
                auVar113 = vfmadd231ps_fma(auVar82._0_32_,auVar135,*pauVar68);
                auVar82 = ZEXT1664(auVar113);
                uVar45 = (ulong)((int)uVar45 - 1);
                pauVar46 = (undefined1 (*) [32])(*pauVar46 + lVar1);
                pauVar68 = pauVar68 + 1;
              }
              pauVar53 = pauVar53 + uVar75;
              pauVar31 = (undefined1 (*) [32])(*pauVar31 + lVar59);
            }
            uVar45 = uVar75;
            pauVar46 = pauVar53;
            if (iVar4 == 1) {
              while ((int)uVar45 != 0) {
                auVar113 = vinsertps_avx(ZEXT416(*(uint *)*pauVar31),
                                         ZEXT416(*(uint *)(*pauVar31 + lVar47 * 4)),0x10);
                auVar113 = vinsertps_avx(auVar113,ZEXT416(*(uint *)(*pauVar31 + lVar72 * 4)),0x20);
                auVar113 = vinsertps_avx(auVar113,ZEXT416(*(uint *)(*pauVar31 + lVar73 * 4)),0x30);
                auVar139 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar31 + lVar22 * 4)),
                                         ZEXT416(*(uint *)(*pauVar31 + lVar23 * 4)),0x10);
                auVar139 = vinsertps_avx(auVar139,ZEXT416(*(uint *)(*pauVar31 + lVar24 * 4)),0x20);
                auVar139 = vinsertps_avx(auVar139,ZEXT416(*(uint *)(*pauVar31 + lVar25 * 4)),0x30);
                auVar136._16_16_ = auVar139;
                auVar136._0_16_ = auVar113;
                auVar113 = vfmadd231ps_fma(auVar82._0_32_,auVar136,*pauVar46);
                auVar82 = ZEXT1664(auVar113);
                pauVar31 = (undefined1 (*) [32])(*pauVar31 + lVar49);
                uVar45 = (ulong)((int)uVar45 - 1);
                pauVar46 = pauVar46 + 1;
              }
              pauVar53 = pauVar53 + uVar75;
            }
            uVar60 = uVar60 + 8;
            lVar63 = lVar63 + lVar39 * 8;
            puVar56 = puVar56 + lVar39 * 2;
          }
          auVar100._0_4_ = auVar82._16_4_ + auVar82._0_4_;
          auVar100._4_4_ = auVar82._20_4_ + auVar82._4_4_;
          auVar100._8_4_ = auVar82._24_4_ + auVar82._8_4_;
          auVar100._12_4_ = auVar82._28_4_ + auVar82._12_4_;
          auVar113 = vshufpd_avx(auVar100,auVar100,1);
          auVar101._0_4_ = auVar113._0_4_ + auVar100._0_4_;
          auVar101._4_4_ = auVar113._4_4_ + auVar100._4_4_;
          auVar101._8_4_ = auVar113._8_4_ + auVar100._8_4_;
          auVar101._12_4_ = auVar113._12_4_ + auVar100._12_4_;
          auVar82 = ZEXT864(0) << 0x40;
          for (; (int)((uint)uVar60 | 3) < local_138; uVar60 = uVar60 + 4) {
            lVar27 = (int)((long)((ulong)(uint)((int)(uint)uVar60 >> 0x1f) << 0x20 |
                                 uVar60 & 0xffffffff) / (long)iVar4) * lVar39;
            if (iVar4 == 4) {
              pauVar54 = (undefined1 (*) [16])((long)local_88.data + lVar27 + (long)iVar52 * 4);
              uVar45 = uVar75;
              pauVar31 = pauVar53;
              while (iVar50 = (int)uVar45, uVar45 = (ulong)(iVar50 - 1), iVar50 != 0) {
                auVar113 = vfmadd231ps_fma(auVar82._0_16_,*pauVar54,*(undefined1 (*) [16])*pauVar31)
                ;
                auVar82 = ZEXT1664(auVar113);
                pauVar31 = (undefined1 (*) [32])(*pauVar31 + 0x10);
                pauVar54 = (undefined1 (*) [16])(*pauVar54 + lVar1);
              }
              pauVar53 = (undefined1 (*) [32])(*pauVar53 + lVar66);
            }
            else {
              pauVar54 = (undefined1 (*) [16])((long)local_88.data + lVar27 + (long)iVar34 * 4);
            }
            uVar45 = uVar75;
            pauVar31 = pauVar53;
            if (iVar4 == 1) {
              while ((int)uVar45 != 0) {
                auVar113 = vinsertps_avx(ZEXT416(*(uint *)*pauVar54),
                                         ZEXT416(*(uint *)(*pauVar54 + lVar47 * 4)),0x10);
                auVar113 = vinsertps_avx(auVar113,ZEXT416(*(uint *)(*pauVar54 + lVar72 * 4)),0x20);
                auVar113 = vinsertps_avx(auVar113,ZEXT416(*(uint *)(*pauVar54 + lVar73 * 4)),0x30);
                auVar113 = vfmadd231ps_fma(auVar82._0_16_,auVar113,*(undefined1 (*) [16])*pauVar31);
                auVar82 = ZEXT1664(auVar113);
                pauVar54 = (undefined1 (*) [16])(*pauVar54 + lVar49);
                uVar45 = (ulong)((int)uVar45 - 1);
                pauVar31 = (undefined1 (*) [32])(*pauVar31 + 0x10);
              }
              pauVar53 = (undefined1 (*) [32])(*pauVar53 + lVar66);
            }
            lVar63 = lVar63 + lVar39 * 4;
            puVar56 = puVar56 + lVar39;
          }
          auVar113 = vmovshdup_avx(auVar101);
          auVar139 = vshufpd_avx(auVar82._0_16_,auVar82._0_16_,1);
          auVar119._0_4_ = auVar139._0_4_ + auVar82._0_4_;
          auVar119._4_4_ = auVar139._4_4_ + auVar82._4_4_;
          auVar119._8_4_ = auVar139._8_4_ + auVar82._8_4_;
          auVar119._12_4_ = auVar139._12_4_ + auVar82._12_4_;
          auVar139 = vmovshdup_avx(auVar119);
          auVar82 = ZEXT464((uint)(auVar113._0_4_ + fVar83 + auVar101._0_4_ +
                                  auVar139._0_4_ + auVar119._0_4_));
          for (; (long)(uVar60 | 1) < lVar37; uVar60 = uVar60 + 2) {
            lVar27 = 0;
            for (lVar71 = 0; iVar74 != (int)lVar71; lVar71 = lVar71 + 1) {
              auVar113 = vfmadd231ss_fma(auVar82._0_16_,ZEXT416(*(uint *)(*pauVar53 + lVar71 * 8)),
                                         ZEXT416(*(uint *)((long)puVar56 + lVar27)));
              auVar113 = vfmadd231ss_fma(auVar113,ZEXT416(*(uint *)(*pauVar53 + lVar71 * 8 + 4)),
                                         ZEXT416(*(uint *)(lVar63 + lVar27)));
              auVar82 = ZEXT1664(auVar113);
              lVar27 = lVar27 + lVar49;
            }
            pauVar53 = (undefined1 (*) [32])(*pauVar53 + uVar75 * 8);
            lVar63 = lVar63 + lVar39 * 2;
            puVar56 = (uint *)((long)puVar56 + lVar39 * 2);
          }
          for (; (long)uVar60 < lVar37; uVar60 = uVar60 + 1) {
            puVar33 = puVar56;
            for (lVar63 = 0; iVar74 != (int)lVar63; lVar63 = lVar63 + 1) {
              auVar113 = vfmadd231ss_fma(auVar82._0_16_,ZEXT416(*(uint *)(*pauVar53 + lVar63 * 4)),
                                         ZEXT416(*puVar33));
              auVar82 = ZEXT1664(auVar113);
              puVar33 = puVar33 + lVar48;
            }
            pauVar53 = (undefined1 (*) [32])(*pauVar53 + uVar75 * 4);
            puVar56 = (uint *)((long)puVar56 + lVar39);
          }
          auVar113 = auVar82._0_16_;
          fVar111 = auVar82._0_4_;
          fVar83 = fVar111;
          switch(iVar6) {
          case 1:
            auVar113 = vmaxss_avx(auVar113,ZEXT416(0));
            fVar83 = auVar113._0_4_;
            break;
          case 2:
            auVar113 = vcmpss_avx(ZEXT416(0) << 0x20,auVar113,1);
            auVar121._8_4_ = 0x3f800000;
            auVar121._0_8_ = 0x3f8000003f800000;
            auVar121._12_4_ = 0x3f800000;
            auVar113 = vblendvps_avx(ZEXT416((uint)*pfVar12),auVar121,auVar113);
            fVar83 = auVar113._0_4_ * fVar111;
            break;
          case 3:
            auVar113 = vmaxss_avx(auVar113,ZEXT416((uint)*pfVar12));
            fVar83 = auVar113._0_4_;
            if (pfVar12[1] < auVar113._0_4_) {
              fVar83 = pfVar12[1];
            }
            break;
          case 4:
            auVar113 = vminss_avx(auVar113,ZEXT416(0x42b0c0a5));
            auVar102._0_8_ = auVar113._0_8_ ^ 0x8000000080000000;
            auVar102._8_4_ = auVar113._8_4_ ^ 0x80000000;
            auVar102._12_4_ = auVar113._12_4_ ^ 0x80000000;
            auVar113 = vcmpss_avx(auVar113,ZEXT416(0xc2b0c0a5),1);
            auVar120._8_4_ = 0x42b0c0a5;
            auVar120._0_8_ = 0x42b0c0a542b0c0a5;
            auVar120._12_4_ = 0x42b0c0a5;
            auVar113 = vblendvps_avx(auVar102,auVar120,auVar113);
            fVar83 = expf(auVar113._0_4_);
            fVar83 = 1.0 / (fVar83 + 1.0);
            break;
          case 5:
            fVar83 = expf(fVar111);
            fVar83 = logf(fVar83 + 1.0);
            fVar83 = tanhf(fVar83);
            fVar83 = fVar83 * fVar111;
            break;
          case 6:
            fVar76 = *pfVar12;
            fVar138 = -pfVar12[1] / fVar76;
            fVar83 = 0.0;
            if ((fVar138 <= fVar111) && (fVar83 = fVar111, fVar111 <= fVar138 + 1.0 / fVar76)) {
              auVar113 = vfmadd213ss_fma(ZEXT416((uint)fVar76),auVar113,ZEXT416((uint)pfVar12[1]));
              fVar83 = auVar113._0_4_ * fVar111;
            }
          }
          *pfVar65 = fVar83;
          pfVar65 = pfVar65 + 1;
          iVar52 = iVar52 + iVar5 * iVar4;
          lVar38 = lVar38 + lVar2;
          lVar57 = lVar57 + lVar2;
        }
      }
    }
  }
  piVar18 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (local_88.allocator == (Allocator *)0x0) {
        free(local_88.data);
      }
      else {
        (*(local_88.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return local_198;
}

Assistant:

int Convolution1D_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}